

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  bool bVar50;
  int iVar51;
  ulong uVar52;
  RTCIntersectArguments *pRVar53;
  undefined4 uVar54;
  ulong uVar55;
  RTCIntersectArguments *pRVar56;
  long lVar57;
  Geometry *geometry;
  long lVar58;
  undefined1 auVar59 [8];
  ulong uVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  float fVar69;
  float fVar70;
  float fVar99;
  float fVar101;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar102;
  float fVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar123;
  float fVar126;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar131;
  float fVar137;
  float fVar138;
  vfloat4 v;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar151;
  float fVar152;
  vfloat4 v_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar164;
  float fVar167;
  undefined1 auVar154 [16];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar172;
  float fVar196;
  float fVar197;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar202;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar212;
  float fVar213;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar250;
  float fVar251;
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar262;
  float fVar264;
  undefined1 auVar258 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar272;
  float fVar274;
  float fVar276;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar275;
  float fVar277;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar278;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  bool local_439;
  int local_3fc;
  undefined1 local_3f8 [8];
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  ulong local_2f8;
  Precalculations *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  RTCFilterFunctionNArguments local_298;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  float local_240;
  float local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  ulong local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  uint local_148;
  float local_144;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  float local_e8 [4];
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8 [4];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 uVar97;
  undefined2 uVar98;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  
  PVar18 = prim[1];
  uVar52 = (ulong)(byte)PVar18;
  lVar22 = uVar52 * 0x25;
  pPVar8 = prim + lVar22 + 6;
  fVar138 = *(float *)(pPVar8 + 0xc);
  fVar139 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar138;
  fVar151 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar138;
  fVar152 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar138;
  fVar131 = fVar138 * (ray->dir).field_0.m128[0];
  fVar137 = fVar138 * (ray->dir).field_0.m128[1];
  fVar138 = fVar138 * (ray->dir).field_0.m128[2];
  uVar54 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar60;
  auVar71._12_2_ = uVar98;
  auVar71._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar133._12_4_ = auVar71._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar60;
  auVar133._10_2_ = uVar98;
  auVar72._10_6_ = auVar133._10_6_;
  auVar72._8_2_ = uVar98;
  auVar72._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar29._4_8_ = auVar72._8_8_;
  auVar29._2_2_ = uVar98;
  auVar29._0_2_ = uVar98;
  fVar265 = (float)((int)sVar68 >> 8);
  fVar272 = (float)(auVar29._0_4_ >> 0x18);
  fVar274 = (float)(auVar72._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar60;
  auVar109._12_2_ = uVar98;
  auVar109._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._10_2_ = uVar98;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar98;
  auVar107._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar30._4_8_ = auVar107._8_8_;
  auVar30._2_2_ = uVar98;
  auVar30._0_2_ = uVar98;
  fVar153 = (float)((int)sVar68 >> 8);
  fVar164 = (float)(auVar30._0_4_ >> 0x18);
  fVar167 = (float)(auVar107._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar60;
  auVar112._12_2_ = uVar98;
  auVar112._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._10_2_ = uVar98;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar98;
  auVar110._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar31._4_8_ = auVar110._8_8_;
  auVar31._2_2_ = uVar98;
  auVar31._0_2_ = uVar98;
  fVar198 = (float)((int)sVar68 >> 8);
  fVar202 = (float)(auVar31._0_4_ >> 0x18);
  fVar203 = (float)(auVar110._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar60;
  auVar115._12_2_ = uVar98;
  auVar115._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar60;
  auVar114._10_2_ = uVar98;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar98;
  auVar113._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar32._4_8_ = auVar113._8_8_;
  auVar32._2_2_ = uVar98;
  auVar32._0_2_ = uVar98;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar99 = (float)(auVar32._0_4_ >> 0x18);
  fVar101 = (float)(auVar113._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar60;
  auVar175._12_2_ = uVar98;
  auVar175._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar60;
  auVar174._10_2_ = uVar98;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar98;
  auVar173._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar33._4_8_ = auVar173._8_8_;
  auVar33._2_2_ = uVar98;
  auVar33._0_2_ = uVar98;
  fVar204 = (float)((int)sVar68 >> 8);
  fVar212 = (float)(auVar33._0_4_ >> 0x18);
  fVar213 = (float)(auVar173._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar52 + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar60;
  auVar178._12_2_ = uVar98;
  auVar178._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar60;
  auVar177._10_2_ = uVar98;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar98;
  auVar176._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar34._4_8_ = auVar176._8_8_;
  auVar34._2_2_ = uVar98;
  auVar34._0_2_ = uVar98;
  fVar217 = (float)((int)sVar68 >> 8);
  fVar223 = (float)(auVar34._0_4_ >> 0x18);
  fVar224 = (float)(auVar176._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar60;
  auVar181._12_2_ = uVar98;
  auVar181._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar60;
  auVar180._10_2_ = uVar98;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar98;
  auVar179._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar35._4_8_ = auVar179._8_8_;
  auVar35._2_2_ = uVar98;
  auVar35._0_2_ = uVar98;
  fVar214 = (float)((int)sVar68 >> 8);
  fVar215 = (float)(auVar35._0_4_ >> 0x18);
  fVar216 = (float)(auVar179._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar60;
  auVar184._12_2_ = uVar98;
  auVar184._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar60;
  auVar183._10_2_ = uVar98;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar98;
  auVar182._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar36._4_8_ = auVar182._8_8_;
  auVar36._2_2_ = uVar98;
  auVar36._0_2_ = uVar98;
  fVar225 = (float)((int)sVar68 >> 8);
  fVar232 = (float)(auVar36._0_4_ >> 0x18);
  fVar235 = (float)(auVar182._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar97 = (undefined1)((uint)uVar54 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar54 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar54));
  uVar97 = (undefined1)((uint)uVar54 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar54,(char)uVar54);
  uVar60 = CONCAT62(uVar28,sVar68);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar60;
  auVar187._12_2_ = uVar98;
  auVar187._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar60;
  auVar186._10_2_ = uVar98;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar98;
  auVar185._0_8_ = uVar60;
  uVar98 = (undefined2)uVar28;
  auVar37._4_8_ = auVar185._8_8_;
  auVar37._2_2_ = uVar98;
  auVar37._0_2_ = uVar98;
  fVar104 = (float)((int)sVar68 >> 8);
  fVar123 = (float)(auVar37._0_4_ >> 0x18);
  fVar126 = (float)(auVar185._8_4_ >> 0x18);
  fVar250 = fVar131 * fVar265 + fVar137 * fVar153 + fVar138 * fVar198;
  fVar259 = fVar131 * fVar272 + fVar137 * fVar164 + fVar138 * fVar202;
  fVar261 = fVar131 * fVar274 + fVar137 * fVar167 + fVar138 * fVar203;
  fVar263 = fVar131 * (float)(auVar133._12_4_ >> 0x18) +
            fVar137 * (float)(auVar108._12_4_ >> 0x18) + fVar138 * (float)(auVar111._12_4_ >> 0x18);
  fVar240 = fVar131 * fVar69 + fVar137 * fVar204 + fVar138 * fVar217;
  fVar247 = fVar131 * fVar99 + fVar137 * fVar212 + fVar138 * fVar223;
  fVar248 = fVar131 * fVar101 + fVar137 * fVar213 + fVar138 * fVar224;
  fVar249 = fVar131 * (float)(auVar114._12_4_ >> 0x18) +
            fVar137 * (float)(auVar174._12_4_ >> 0x18) + fVar138 * (float)(auVar177._12_4_ >> 0x18);
  fVar172 = fVar131 * fVar214 + fVar137 * fVar225 + fVar138 * fVar104;
  fVar196 = fVar131 * fVar215 + fVar137 * fVar232 + fVar138 * fVar123;
  fVar197 = fVar131 * fVar216 + fVar137 * fVar235 + fVar138 * fVar126;
  fVar131 = fVar131 * (float)(auVar180._12_4_ >> 0x18) +
            fVar137 * (float)(auVar183._12_4_ >> 0x18) + fVar138 * (float)(auVar186._12_4_ >> 0x18);
  fVar266 = fVar265 * fVar139 + fVar153 * fVar151 + fVar198 * fVar152;
  fVar272 = fVar272 * fVar139 + fVar164 * fVar151 + fVar202 * fVar152;
  fVar274 = fVar274 * fVar139 + fVar167 * fVar151 + fVar203 * fVar152;
  fVar276 = (float)(auVar133._12_4_ >> 0x18) * fVar139 +
            (float)(auVar108._12_4_ >> 0x18) * fVar151 + (float)(auVar111._12_4_ >> 0x18) * fVar152;
  fVar217 = fVar69 * fVar139 + fVar204 * fVar151 + fVar217 * fVar152;
  fVar223 = fVar99 * fVar139 + fVar212 * fVar151 + fVar223 * fVar152;
  fVar224 = fVar101 * fVar139 + fVar213 * fVar151 + fVar224 * fVar152;
  fVar265 = (float)(auVar114._12_4_ >> 0x18) * fVar139 +
            (float)(auVar174._12_4_ >> 0x18) * fVar151 + (float)(auVar177._12_4_ >> 0x18) * fVar152;
  fVar214 = fVar139 * fVar214 + fVar151 * fVar225 + fVar152 * fVar104;
  fVar215 = fVar139 * fVar215 + fVar151 * fVar232 + fVar152 * fVar123;
  fVar216 = fVar139 * fVar216 + fVar151 * fVar235 + fVar152 * fVar126;
  fVar225 = fVar139 * (float)(auVar180._12_4_ >> 0x18) +
            fVar151 * (float)(auVar183._12_4_ >> 0x18) + fVar152 * (float)(auVar186._12_4_ >> 0x18);
  fVar138 = (float)DAT_01ff1d40;
  fVar69 = DAT_01ff1d40._4_4_;
  fVar99 = DAT_01ff1d40._8_4_;
  fVar101 = DAT_01ff1d40._12_4_;
  uVar62 = -(uint)(fVar138 <= ABS(fVar250));
  uVar63 = -(uint)(fVar69 <= ABS(fVar259));
  uVar64 = -(uint)(fVar99 <= ABS(fVar261));
  uVar65 = -(uint)(fVar101 <= ABS(fVar263));
  auVar252._0_4_ = (uint)fVar250 & uVar62;
  auVar252._4_4_ = (uint)fVar259 & uVar63;
  auVar252._8_4_ = (uint)fVar261 & uVar64;
  auVar252._12_4_ = (uint)fVar263 & uVar65;
  auVar140._0_4_ = ~uVar62 & (uint)fVar138;
  auVar140._4_4_ = ~uVar63 & (uint)fVar69;
  auVar140._8_4_ = ~uVar64 & (uint)fVar99;
  auVar140._12_4_ = ~uVar65 & (uint)fVar101;
  auVar140 = auVar140 | auVar252;
  uVar62 = -(uint)(fVar138 <= ABS(fVar240));
  uVar63 = -(uint)(fVar69 <= ABS(fVar247));
  uVar64 = -(uint)(fVar99 <= ABS(fVar248));
  uVar65 = -(uint)(fVar101 <= ABS(fVar249));
  auVar241._0_4_ = (uint)fVar240 & uVar62;
  auVar241._4_4_ = (uint)fVar247 & uVar63;
  auVar241._8_4_ = (uint)fVar248 & uVar64;
  auVar241._12_4_ = (uint)fVar249 & uVar65;
  auVar199._0_4_ = ~uVar62 & (uint)fVar138;
  auVar199._4_4_ = ~uVar63 & (uint)fVar69;
  auVar199._8_4_ = ~uVar64 & (uint)fVar99;
  auVar199._12_4_ = ~uVar65 & (uint)fVar101;
  auVar199 = auVar199 | auVar241;
  uVar62 = -(uint)(fVar138 <= ABS(fVar172));
  uVar63 = -(uint)(fVar69 <= ABS(fVar196));
  uVar64 = -(uint)(fVar99 <= ABS(fVar197));
  uVar65 = -(uint)(fVar101 <= ABS(fVar131));
  auVar188._0_4_ = (uint)fVar172 & uVar62;
  auVar188._4_4_ = (uint)fVar196 & uVar63;
  auVar188._8_4_ = (uint)fVar197 & uVar64;
  auVar188._12_4_ = (uint)fVar131 & uVar65;
  auVar205._0_4_ = ~uVar62 & (uint)fVar138;
  auVar205._4_4_ = ~uVar63 & (uint)fVar69;
  auVar205._8_4_ = ~uVar64 & (uint)fVar99;
  auVar205._12_4_ = ~uVar65 & (uint)fVar101;
  auVar205 = auVar205 | auVar188;
  auVar72 = rcpps(_DAT_01ff1d40,auVar140);
  fVar138 = auVar72._0_4_;
  fVar101 = auVar72._4_4_;
  fVar153 = auVar72._8_4_;
  fVar204 = auVar72._12_4_;
  fVar138 = (1.0 - auVar140._0_4_ * fVar138) * fVar138 + fVar138;
  fVar101 = (1.0 - auVar140._4_4_ * fVar101) * fVar101 + fVar101;
  fVar153 = (1.0 - auVar140._8_4_ * fVar153) * fVar153 + fVar153;
  fVar204 = (1.0 - auVar140._12_4_ * fVar204) * fVar204 + fVar204;
  auVar72 = rcpps(auVar72,auVar199);
  fVar69 = auVar72._0_4_;
  fVar104 = auVar72._4_4_;
  fVar164 = auVar72._8_4_;
  fVar212 = auVar72._12_4_;
  fVar69 = (1.0 - auVar199._0_4_ * fVar69) * fVar69 + fVar69;
  fVar104 = (1.0 - auVar199._4_4_ * fVar104) * fVar104 + fVar104;
  fVar164 = (1.0 - auVar199._8_4_ * fVar164) * fVar164 + fVar164;
  fVar212 = (1.0 - auVar199._12_4_ * fVar212) * fVar212 + fVar212;
  auVar72 = rcpps(auVar72,auVar205);
  fVar99 = auVar72._0_4_;
  fVar123 = auVar72._4_4_;
  fVar167 = auVar72._8_4_;
  fVar213 = auVar72._12_4_;
  fVar99 = (1.0 - auVar205._0_4_ * fVar99) * fVar99 + fVar99;
  fVar123 = (1.0 - auVar205._4_4_ * fVar123) * fVar123 + fVar123;
  fVar167 = (1.0 - auVar205._8_4_ * fVar167) * fVar167 + fVar167;
  fVar213 = (1.0 - auVar205._12_4_ * fVar213) * fVar213 + fVar213;
  fVar232 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar98 = (undefined2)(uVar60 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._12_2_ = uVar98;
  auVar75._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar60 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar60;
  auVar74._10_2_ = uVar98;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar98;
  auVar73._0_8_ = uVar60;
  uVar98 = (undefined2)(uVar60 >> 0x10);
  auVar38._4_8_ = auVar73._8_8_;
  auVar38._2_2_ = uVar98;
  auVar38._0_2_ = uVar98;
  fVar126 = (float)(auVar38._0_4_ >> 0x10);
  fVar172 = (float)(auVar73._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar98 = (undefined2)(uVar61 >> 0x30);
  auVar143._8_4_ = 0;
  auVar143._0_8_ = uVar61;
  auVar143._12_2_ = uVar98;
  auVar143._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar61 >> 0x20);
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._8_2_ = 0;
  auVar142._0_8_ = uVar61;
  auVar142._10_2_ = uVar98;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._8_2_ = uVar98;
  auVar141._0_8_ = uVar61;
  uVar98 = (undefined2)(uVar61 >> 0x10);
  auVar39._4_8_ = auVar141._8_8_;
  auVar39._2_2_ = uVar98;
  auVar39._0_2_ = uVar98;
  uVar10 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar98 = (undefined2)(uVar10 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar10;
  auVar78._12_2_ = uVar98;
  auVar78._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar10 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar10;
  auVar77._10_2_ = uVar98;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar98;
  auVar76._0_8_ = uVar10;
  uVar98 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar76._8_8_;
  auVar40._2_2_ = uVar98;
  auVar40._0_2_ = uVar98;
  fVar131 = (float)(auVar40._0_4_ >> 0x10);
  fVar196 = (float)(auVar76._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar98 = (undefined2)(uVar11 >> 0x30);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar11;
  auVar208._12_2_ = uVar98;
  auVar208._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar11 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar11;
  auVar207._10_2_ = uVar98;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar98;
  auVar206._0_8_ = uVar11;
  uVar98 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar206._8_8_;
  auVar41._2_2_ = uVar98;
  auVar41._0_2_ = uVar98;
  uVar12 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar98 = (undefined2)(uVar12 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar12;
  auVar81._12_2_ = uVar98;
  auVar81._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar12 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar12;
  auVar80._10_2_ = uVar98;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar98;
  auVar79._0_8_ = uVar12;
  uVar98 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar79._8_8_;
  auVar42._2_2_ = uVar98;
  auVar42._0_2_ = uVar98;
  fVar137 = (float)(auVar42._0_4_ >> 0x10);
  fVar197 = (float)(auVar79._8_4_ >> 0x10);
  uVar55 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar52 * 2 + uVar55 + 6);
  uVar98 = (undefined2)(uVar13 >> 0x30);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar13;
  auVar220._12_2_ = uVar98;
  auVar220._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar13 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar13;
  auVar219._10_2_ = uVar98;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar98;
  auVar218._0_8_ = uVar13;
  uVar98 = (undefined2)(uVar13 >> 0x10);
  auVar43._4_8_ = auVar218._8_8_;
  auVar43._2_2_ = uVar98;
  auVar43._0_2_ = uVar98;
  uVar55 = *(ulong *)(prim + uVar55 + 6);
  uVar98 = (undefined2)(uVar55 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar55;
  auVar84._12_2_ = uVar98;
  auVar84._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar55 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar55;
  auVar83._10_2_ = uVar98;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar98;
  auVar82._0_8_ = uVar55;
  uVar98 = (undefined2)(uVar55 >> 0x10);
  auVar44._4_8_ = auVar82._8_8_;
  auVar44._2_2_ = uVar98;
  auVar44._0_2_ = uVar98;
  fVar139 = (float)(auVar44._0_4_ >> 0x10);
  fVar198 = (float)(auVar82._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar98 = (undefined2)(uVar14 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar14;
  auVar230._12_2_ = uVar98;
  auVar230._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar14 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar14;
  auVar229._10_2_ = uVar98;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar98;
  auVar228._0_8_ = uVar14;
  uVar98 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar228._8_8_;
  auVar45._2_2_ = uVar98;
  auVar45._0_2_ = uVar98;
  uVar15 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar98 = (undefined2)(uVar15 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar15;
  auVar87._12_2_ = uVar98;
  auVar87._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar15 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar15;
  auVar86._10_2_ = uVar98;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar98;
  auVar85._0_8_ = uVar15;
  uVar98 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar85._8_8_;
  auVar46._2_2_ = uVar98;
  auVar46._0_2_ = uVar98;
  fVar151 = (float)(auVar46._0_4_ >> 0x10);
  fVar202 = (float)(auVar85._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar98 = (undefined2)(uVar16 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar16;
  auVar244._12_2_ = uVar98;
  auVar244._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar16 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar16;
  auVar243._10_2_ = uVar98;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar98;
  auVar242._0_8_ = uVar16;
  uVar98 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar242._8_8_;
  auVar47._2_2_ = uVar98;
  auVar47._0_2_ = uVar98;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar52) + 6);
  uVar98 = (undefined2)(uVar17 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar17;
  auVar90._12_2_ = uVar98;
  auVar90._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar17 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar17;
  auVar89._10_2_ = uVar98;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar98;
  auVar88._0_8_ = uVar17;
  uVar98 = (undefined2)(uVar17 >> 0x10);
  auVar48._4_8_ = auVar88._8_8_;
  auVar48._2_2_ = uVar98;
  auVar48._0_2_ = uVar98;
  fVar152 = (float)(auVar48._0_4_ >> 0x10);
  fVar203 = (float)(auVar88._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar98 = (undefined2)(uVar52 >> 0x30);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar52;
  auVar255._12_2_ = uVar98;
  auVar255._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar52 >> 0x20);
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar52;
  auVar254._10_2_ = uVar98;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._8_2_ = uVar98;
  auVar253._0_8_ = uVar52;
  uVar98 = (undefined2)(uVar52 >> 0x10);
  auVar49._4_8_ = auVar253._8_8_;
  auVar49._2_2_ = uVar98;
  auVar49._0_2_ = uVar98;
  auVar144._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar126) * fVar232 + fVar126) - fVar272) *
                fVar101,((((float)(int)(short)uVar61 - (float)(int)(short)uVar60) * fVar232 +
                         (float)(int)(short)uVar60) - fVar266) * fVar138);
  auVar144._8_4_ =
       ((((float)(auVar141._8_4_ >> 0x10) - fVar172) * fVar232 + fVar172) - fVar274) * fVar153;
  auVar144._12_4_ =
       ((((float)(auVar142._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar276) * fVar204;
  auVar209._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar232 +
        (float)(int)(short)uVar10) - fVar266) * fVar138;
  auVar209._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar131) * fVar232 + fVar131) - fVar272) * fVar101;
  auVar209._8_4_ =
       ((((float)(auVar206._8_4_ >> 0x10) - fVar196) * fVar232 + fVar196) - fVar274) * fVar153;
  auVar209._12_4_ =
       ((((float)(auVar207._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar276) * fVar204;
  auVar221._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar137) * fVar232 + fVar137) - fVar223) *
                fVar104,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar232 +
                         (float)(int)(short)uVar12) - fVar217) * fVar69);
  auVar221._8_4_ =
       ((((float)(auVar218._8_4_ >> 0x10) - fVar197) * fVar232 + fVar197) - fVar224) * fVar164;
  auVar221._12_4_ =
       ((((float)(auVar219._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar265) * fVar212;
  auVar231._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar55) * fVar232 +
        (float)(int)(short)uVar55) - fVar217) * fVar69;
  auVar231._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar139) * fVar232 + fVar139) - fVar223) * fVar104;
  auVar231._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar198) * fVar232 + fVar198) - fVar224) * fVar164;
  auVar231._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar265) * fVar212;
  auVar245._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar151) * fVar232 + fVar151) - fVar215) *
                fVar123,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar232 +
                         (float)(int)(short)uVar15) - fVar214) * fVar99);
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar202) * fVar232 + fVar202) - fVar216) * fVar167;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar225) * fVar213;
  auVar256._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar17) * fVar232 +
        (float)(int)(short)uVar17) - fVar214) * fVar99;
  auVar256._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar152) * fVar232 + fVar152) - fVar215) * fVar123;
  auVar256._8_4_ =
       ((((float)(auVar253._8_4_ >> 0x10) - fVar203) * fVar232 + fVar203) - fVar216) * fVar167;
  auVar256._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar232 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar225) * fVar213;
  auVar132._8_4_ = auVar144._8_4_;
  auVar132._0_8_ = auVar144._0_8_;
  auVar132._12_4_ = auVar144._12_4_;
  auVar133 = minps(auVar132,auVar209);
  auVar91._8_4_ = auVar221._8_4_;
  auVar91._0_8_ = auVar221._0_8_;
  auVar91._12_4_ = auVar221._12_4_;
  auVar72 = minps(auVar91,auVar231);
  auVar133 = maxps(auVar133,auVar72);
  auVar92._8_4_ = auVar245._8_4_;
  auVar92._0_8_ = auVar245._0_8_;
  auVar92._12_4_ = auVar245._12_4_;
  auVar72 = minps(auVar92,auVar256);
  uVar54 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar116._4_4_ = uVar54;
  auVar116._0_4_ = uVar54;
  auVar116._8_4_ = uVar54;
  auVar116._12_4_ = uVar54;
  auVar72 = maxps(auVar72,auVar116);
  auVar72 = maxps(auVar133,auVar72);
  local_48 = auVar72._0_4_ * 0.99999964;
  fStack_44 = auVar72._4_4_ * 0.99999964;
  fStack_40 = auVar72._8_4_ * 0.99999964;
  fStack_3c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar144,auVar209);
  auVar133 = maxps(auVar221,auVar231);
  auVar72 = minps(auVar72,auVar133);
  auVar133 = maxps(auVar245,auVar256);
  fVar138 = ray->tfar;
  auVar93._4_4_ = fVar138;
  auVar93._0_4_ = fVar138;
  auVar93._8_4_ = fVar138;
  auVar93._12_4_ = fVar138;
  auVar133 = minps(auVar133,auVar93);
  auVar72 = minps(auVar72,auVar133);
  uVar62 = (uint)(byte)PVar18;
  auVar117._0_4_ = -(uint)(uVar62 != 0 && local_48 <= auVar72._0_4_ * 1.0000004);
  auVar117._4_4_ = -(uint)(1 < uVar62 && fStack_44 <= auVar72._4_4_ * 1.0000004);
  auVar117._8_4_ = -(uint)(2 < uVar62 && fStack_40 <= auVar72._8_4_ * 1.0000004);
  auVar117._12_4_ = -(uint)(3 < uVar62 && fStack_3c <= auVar72._12_4_ * 1.0000004);
  uVar62 = movmskps(uVar62,auVar117);
  local_439 = uVar62 != 0;
  if (local_439) {
    uVar62 = uVar62 & 0xff;
    local_2d8 = mm_lookupmask_ps._0_8_;
    uStack_2d0 = mm_lookupmask_ps._8_8_;
    local_2f0 = pre;
    do {
      lVar22 = 0;
      if (uVar62 != 0) {
        for (; (uVar62 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      local_2f8 = (ulong)*(uint *)(prim + 2);
      local_210 = (ulong)*(uint *)(prim + lVar22 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_2f8].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_210 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar138 = pGVar19->fnumTimeSegments;
      fVar69 = (pGVar19->time_range).lower;
      fVar99 = (((ray->dir).field_0.m128[3] - fVar69) / ((pGVar19->time_range).upper - fVar69)) *
               fVar138;
      fVar69 = floorf(fVar99);
      fVar138 = fVar138 + -1.0;
      if (fVar138 <= fVar69) {
        fVar69 = fVar138;
      }
      fVar138 = 0.0;
      if (0.0 <= fVar69) {
        fVar138 = fVar69;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar57 = (long)(int)fVar138 * 0x38;
      lVar22 = *(long *)(_Var20 + 0x10 + lVar57);
      auVar59 = (undefined1  [8])(lVar22 * uVar60);
      lVar58 = *(long *)(_Var20 + 0x38 + lVar57);
      lVar21 = *(long *)(_Var20 + 0x48 + lVar57);
      pfVar1 = (float *)(lVar58 + uVar60 * lVar21);
      pfVar2 = (float *)(lVar58 + (uVar60 + 1) * lVar21);
      pfVar3 = (float *)(lVar58 + (uVar60 + 2) * lVar21);
      fVar99 = fVar99 - fVar138;
      fVar138 = 1.0 - fVar99;
      uVar61 = lVar21 * (uVar60 + 3);
      pfVar4 = (float *)(lVar58 + uVar61);
      lVar58 = *(long *)(_Var20 + lVar57);
      pfVar5 = (float *)((long)&(((Geometry *)auVar59)->super_RefCount)._vptr_RefCount + lVar58);
      pfVar6 = (float *)(lVar58 + lVar22 * (uVar60 + 1));
      local_1f8 = *pfVar5 * fVar138 + *pfVar1 * fVar99;
      fStack_1f4 = pfVar5[1] * fVar138 + pfVar1[1] * fVar99;
      fStack_1f0 = pfVar5[2] * fVar138 + pfVar1[2] * fVar99;
      fStack_1ec = pfVar5[3] * fVar138 + pfVar1[3] * fVar99;
      local_88 = *pfVar6 * fVar138 + *pfVar2 * fVar99;
      fStack_84 = pfVar6[1] * fVar138 + pfVar2[1] * fVar99;
      fStack_80 = pfVar6[2] * fVar138 + pfVar2[2] * fVar99;
      fStack_7c = pfVar6[3] * fVar138 + pfVar2[3] * fVar99;
      pfVar1 = (float *)(lVar58 + lVar22 * (uVar60 + 2));
      local_98 = *pfVar1 * fVar138 + *pfVar3 * fVar99;
      fStack_94 = pfVar1[1] * fVar138 + pfVar3[1] * fVar99;
      fStack_90 = pfVar1[2] * fVar138 + pfVar3[2] * fVar99;
      fStack_8c = pfVar1[3] * fVar138 + pfVar3[3] * fVar99;
      pfVar1 = (float *)(lVar58 + lVar22 * (uVar60 + 3));
      local_78 = fVar138 * *pfVar1 + fVar99 * *pfVar4;
      fStack_74 = fVar138 * pfVar1[1] + fVar99 * pfVar4[1];
      fStack_70 = fVar138 * pfVar1[2] + fVar99 * pfVar4[2];
      fStack_6c = fVar138 * pfVar1[3] + fVar99 * pfVar4[3];
      fVar138 = *(float *)&pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
      fVar69 = (ray->org).field_0.m128[0];
      fVar99 = (ray->org).field_0.m128[1];
      fVar101 = (ray->org).field_0.m128[2];
      fVar196 = local_1f8 - fVar69;
      fVar197 = fStack_1f4 - fVar99;
      fVar198 = fStack_1f0 - fVar101;
      fVar104 = (local_2f0->ray_space).vx.field_0.m128[0];
      fVar123 = (local_2f0->ray_space).vx.field_0.m128[1];
      fVar126 = (local_2f0->ray_space).vx.field_0.m128[2];
      fVar131 = (local_2f0->ray_space).vx.field_0.m128[3];
      fVar137 = (local_2f0->ray_space).vy.field_0.m128[0];
      fVar139 = (local_2f0->ray_space).vy.field_0.m128[1];
      fVar151 = (local_2f0->ray_space).vy.field_0.m128[2];
      fVar152 = (local_2f0->ray_space).vy.field_0.m128[3];
      fVar153 = (local_2f0->ray_space).vz.field_0.m128[0];
      fVar164 = (local_2f0->ray_space).vz.field_0.m128[1];
      fVar167 = (local_2f0->ray_space).vz.field_0.m128[2];
      fVar172 = (local_2f0->ray_space).vz.field_0.m128[3];
      local_1b8 = fVar196 * fVar104 + fVar197 * fVar137 + fVar198 * fVar153;
      local_1c8 = fVar196 * fVar123 + fVar197 * fVar139 + fVar198 * fVar164;
      fVar198 = fVar196 * fVar126 + fVar197 * fVar151 + fVar198 * fVar167;
      fVar197 = local_88 - fVar69;
      fVar202 = fStack_84 - fVar99;
      fVar203 = fStack_80 - fVar101;
      fVar196 = fVar197 * fVar104 + fVar202 * fVar137 + fVar203 * fVar153;
      local_1d8 = fVar197 * fVar123 + fVar202 * fVar139 + fVar203 * fVar164;
      fVar212 = fVar197 * fVar126 + fVar202 * fVar151 + fVar203 * fVar167;
      fVar202 = local_98 - fVar69;
      fVar203 = fStack_94 - fVar99;
      fVar204 = fStack_90 - fVar101;
      local_358 = fVar202 * fVar104 + fVar203 * fVar137 + fVar204 * fVar153;
      local_368 = fVar202 * fVar123 + fVar203 * fVar139 + fVar204 * fVar164;
      fVar197 = fVar202 * fVar126 + fVar203 * fVar151 + fVar204 * fVar167;
      fStack_36c = fVar202 * fVar131 + fVar203 * fVar152 + fVar204 * fVar172;
      fVar69 = local_78 - fVar69;
      fVar99 = fStack_74 - fVar99;
      fVar101 = fStack_70 - fVar101;
      local_308 = fVar69 * fVar104 + fVar99 * fVar137 + fVar101 * fVar153;
      local_3a8 = fVar69 * fVar123 + fVar99 * fVar139 + fVar101 * fVar164;
      fVar104 = fVar69 * fVar126 + fVar99 * fVar151 + fVar101 * fVar167;
      fStack_37c = fVar69 * fVar131 + fVar99 * fVar152 + fVar101 * fVar172;
      auVar145._0_8_ = CONCAT44(local_1c8,local_1b8) & 0x7fffffff7fffffff;
      auVar145._8_4_ = ABS(fVar198);
      auVar145._12_4_ = ABS(fStack_1ec);
      auVar154._0_8_ = CONCAT44(local_1d8,fVar196) & 0x7fffffff7fffffff;
      auVar154._8_4_ = ABS(fVar212);
      auVar154._12_4_ = ABS(fStack_7c);
      auVar72 = maxps(auVar145,auVar154);
      auVar189._0_8_ = CONCAT44(local_368,local_358) & 0x7fffffff7fffffff;
      auVar189._8_4_ = ABS(fVar197);
      auVar189._12_4_ = ABS(fStack_8c);
      auVar118._0_8_ = CONCAT44(local_3a8,local_308) & 0x7fffffff7fffffff;
      auVar118._8_4_ = ABS(fVar104);
      auVar118._12_4_ = ABS(fStack_6c);
      auVar133 = maxps(auVar189,auVar118);
      auVar72 = maxps(auVar72,auVar133);
      fVar69 = auVar72._4_4_;
      if (auVar72._4_4_ <= auVar72._0_4_) {
        fVar69 = auVar72._0_4_;
      }
      auVar146._8_8_ = auVar72._8_8_;
      auVar146._0_8_ = auVar72._8_8_;
      fVar99 = (float)(int)fVar138;
      _local_208 = ZEXT416((uint)fVar99);
      if (auVar72._8_4_ <= fVar69) {
        auVar146._0_4_ = fVar69;
      }
      local_3f8._4_4_ = -(uint)(1.0 < fVar99);
      local_3f8._0_4_ = -(uint)(0.0 < fVar99);
      uStack_3f0._0_4_ = (float)-(uint)(2.0 < fVar99);
      uStack_3f0._4_4_ = -(uint)(3.0 < fVar99);
      pRVar56 = (RTCIntersectArguments *)((long)(int)fVar138 * 0x40);
      lVar22 = (long)(int)fVar138 * 0x44;
      pauVar9 = (undefined1 (*) [16])(catmullrom_basis0 + lVar22 + 0x908);
      fVar69 = *(float *)*pauVar9;
      fVar101 = *(float *)(catmullrom_basis0 + lVar22 + 0x90c);
      fVar123 = *(float *)(catmullrom_basis0 + lVar22 + 0x910);
      auVar29 = *(undefined1 (*) [12])*pauVar9;
      fVar126 = *(float *)(catmullrom_basis0 + lVar22 + 0x914);
      _local_398 = *pauVar9;
      fVar131 = *(float *)(catmullrom_basis0 + lVar22 + 0xd8c);
      fVar137 = *(float *)(catmullrom_basis0 + lVar22 + 0xd90);
      fVar139 = *(float *)(catmullrom_basis0 + lVar22 + 0xd94);
      fVar151 = *(float *)(catmullrom_basis0 + lVar22 + 0xd98);
      local_68 = fStack_8c;
      fStack_64 = fStack_8c;
      fStack_60 = fStack_8c;
      fStack_5c = fStack_8c;
      local_348 = *(float *)(catmullrom_basis0 + lVar22 + 0x484);
      fStack_344 = *(float *)(catmullrom_basis0 + lVar22 + 0x488);
      fStack_340 = *(float *)(catmullrom_basis0 + lVar22 + 0x48c);
      fStack_33c = *(float *)(catmullrom_basis0 + lVar22 + 0x490);
      local_258 = *(float *)(catmullrom_basis0 + lVar22);
      fStack_254 = *(float *)(catmullrom_basis0 + lVar22 + 4);
      fStack_250 = *(float *)(catmullrom_basis0 + lVar22 + 8);
      fStack_24c = *(float *)(catmullrom_basis0 + lVar22 + 0xc);
      local_338._0_4_ =
           local_1b8 * local_258 + fVar196 * local_348 + local_358 * fVar69 + local_308 * fVar131;
      local_338._4_4_ =
           local_1b8 * fStack_254 + fVar196 * fStack_344 + local_358 * fVar101 + local_308 * fVar137
      ;
      uStack_330._0_4_ =
           local_1b8 * fStack_250 + fVar196 * fStack_340 + local_358 * fVar123 + local_308 * fVar139
      ;
      uStack_330._4_4_ =
           local_1b8 * fStack_24c + fVar196 * fStack_33c + local_358 * fVar126 + local_308 * fVar151
      ;
      fVar247 = local_1c8 * local_258 +
                local_1d8 * local_348 + local_368 * fVar69 + local_3a8 * fVar131;
      fVar249 = local_1c8 * fStack_254 +
                local_1d8 * fStack_344 + local_368 * fVar101 + local_3a8 * fVar137;
      fVar259 = local_1c8 * fStack_250 +
                local_1d8 * fStack_340 + local_368 * fVar123 + local_3a8 * fVar139;
      fVar263 = local_1c8 * fStack_24c +
                local_1d8 * fStack_33c + local_368 * fVar126 + local_3a8 * fVar151;
      local_3c8._0_4_ =
           fStack_1ec * local_258 + fStack_7c * local_348 + fStack_8c * fVar69 + fStack_6c * fVar131
      ;
      local_3c8._4_4_ =
           fStack_1ec * fStack_254 +
           fStack_7c * fStack_344 + fStack_8c * fVar101 + fStack_6c * fVar137;
      local_3c8._8_4_ =
           fStack_1ec * fStack_250 +
           fStack_7c * fStack_340 + fStack_8c * fVar123 + fStack_6c * fVar139;
      local_3c8._12_4_ =
           fStack_1ec * fStack_24c +
           fStack_7c * fStack_33c + fStack_8c * fVar126 + fStack_6c * fVar151;
      local_3d8 = *(float *)(catmullrom_basis1 + lVar22 + 0xd8c);
      fStack_3d4 = *(float *)(catmullrom_basis1 + lVar22 + 0xd90);
      fStack_3d0 = *(float *)(catmullrom_basis1 + lVar22 + 0xd94);
      fStack_3cc = *(float *)(catmullrom_basis1 + lVar22 + 0xd98);
      fVar101 = *(float *)(catmullrom_basis1 + lVar22 + 0x908);
      fVar123 = *(float *)(catmullrom_basis1 + lVar22 + 0x90c);
      fVar152 = *(float *)(catmullrom_basis1 + lVar22 + 0x910);
      fVar153 = *(float *)(catmullrom_basis1 + lVar22 + 0x914);
      local_58 = fStack_6c;
      fStack_54 = fStack_6c;
      fStack_50 = fStack_6c;
      fStack_4c = fStack_6c;
      fVar164 = *(float *)(catmullrom_basis1 + lVar22 + 0x484);
      fVar167 = *(float *)(catmullrom_basis1 + lVar22 + 0x488);
      fVar172 = *(float *)(catmullrom_basis1 + lVar22 + 0x48c);
      fVar202 = *(float *)(catmullrom_basis1 + lVar22 + 0x490);
      local_a8 = fStack_7c;
      fStack_a4 = fStack_7c;
      fStack_a0 = fStack_7c;
      fStack_9c = fStack_7c;
      fVar203 = *(float *)(catmullrom_basis1 + lVar22);
      fVar204 = *(float *)(catmullrom_basis1 + lVar22 + 4);
      fVar213 = *(float *)(catmullrom_basis1 + lVar22 + 8);
      fVar217 = *(float *)(catmullrom_basis1 + lVar22 + 0xc);
      fVar274 = local_1b8 * fVar203 +
                fVar196 * fVar164 + local_358 * fVar101 + local_308 * local_3d8;
      fVar165 = local_1b8 * fVar204 +
                fVar196 * fVar167 + local_358 * fVar123 + local_308 * fStack_3d4;
      fVar168 = local_1b8 * fVar213 +
                fVar196 * fVar172 + local_358 * fVar152 + local_308 * fStack_3d0;
      fVar170 = local_1b8 * fVar217 +
                fVar196 * fVar202 + local_358 * fVar153 + local_308 * fStack_3cc;
      fVar266 = local_1c8 * fVar203 +
                local_1d8 * fVar164 + local_368 * fVar101 + local_3a8 * local_3d8;
      fVar272 = local_1c8 * fVar204 +
                local_1d8 * fVar167 + local_368 * fVar123 + local_3a8 * fStack_3d4;
      fStack_3b0 = local_1c8 * fVar213 +
                   local_1d8 * fVar172 + local_368 * fVar152 + local_3a8 * fStack_3d0;
      fStack_3ac = local_1c8 * fVar217 +
                   local_1d8 * fVar202 + local_368 * fVar153 + local_3a8 * fStack_3cc;
      local_b8 = fStack_1ec;
      fStack_b4 = fStack_1ec;
      fStack_b0 = fStack_1ec;
      fStack_ac = fStack_1ec;
      auVar210._0_4_ =
           fStack_1ec * fVar203 + fStack_7c * fVar164 + fStack_8c * fVar101 + fStack_6c * local_3d8;
      auVar210._4_4_ =
           fStack_1ec * fVar204 + fStack_7c * fVar167 + fStack_8c * fVar123 + fStack_6c * fStack_3d4
      ;
      auVar210._8_4_ =
           fStack_1ec * fVar213 + fStack_7c * fVar172 + fStack_8c * fVar152 + fStack_6c * fStack_3d0
      ;
      auVar210._12_4_ =
           fStack_1ec * fVar217 + fStack_7c * fVar202 + fStack_8c * fVar153 + fStack_6c * fStack_3cc
      ;
      local_318 = CONCAT44(fVar165,fVar274);
      uStack_310 = CONCAT44(fVar170,fVar168);
      fVar276 = fVar274 - (float)local_338._0_4_;
      fVar166 = fVar165 - (float)local_338._4_4_;
      fVar169 = fVar168 - (float)uStack_330;
      fVar171 = fVar170 - uStack_330._4_4_;
      local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar272,fVar266);
      fVar240 = fVar266 - fVar247;
      fVar248 = fVar272 - fVar249;
      fVar250 = fStack_3b0 - fVar259;
      fVar261 = fStack_3ac - fVar263;
      local_328 = CONCAT44(fVar249,fVar247);
      uStack_320 = CONCAT44(fVar263,fVar259);
      fVar69 = fVar247 * fVar276 - (float)local_338._0_4_ * fVar240;
      fVar223 = fVar249 * fVar166 - (float)local_338._4_4_ * fVar248;
      fVar224 = fVar259 * fVar169 - (float)uStack_330 * fVar250;
      fVar265 = fVar263 * fVar171 - uStack_330._4_4_ * fVar261;
      auVar72 = maxps(local_3c8,auVar210);
      bVar25 = fVar69 * fVar69 <=
               auVar72._0_4_ * auVar72._0_4_ * (fVar276 * fVar276 + fVar240 * fVar240) &&
               0.0 < fVar99;
      auVar190._0_4_ = -(uint)bVar25;
      bVar50 = fVar223 * fVar223 <=
               auVar72._4_4_ * auVar72._4_4_ * (fVar166 * fVar166 + fVar248 * fVar248) &&
               1.0 < fVar99;
      auVar190._4_4_ = -(uint)bVar50;
      bVar24 = fVar224 * fVar224 <=
               auVar72._8_4_ * auVar72._8_4_ * (fVar169 * fVar169 + fVar250 * fVar250) &&
               2.0 < fVar99;
      auVar190._8_4_ = -(uint)bVar24;
      bVar23 = fVar265 * fVar265 <=
               auVar72._12_4_ * auVar72._12_4_ * (fVar171 * fVar171 + fVar261 * fVar261) &&
               3.0 < fVar99;
      auVar190._12_4_ = -(uint)bVar23;
      local_2a8 = auVar146._0_4_;
      fStack_2a4 = auVar146._4_4_;
      fStack_2a0 = auVar146._8_4_;
      fStack_29c = auVar146._12_4_;
      local_2a8 = local_2a8 * 4.7683716e-07;
      iVar51 = movmskps(fVar138,auVar190);
      fVar69 = (ray->org).field_0.m128[3];
      _local_1e8 = ZEXT416((uint)fVar69);
      fVar223 = fVar196;
      fVar224 = fVar196;
      fVar265 = fVar196;
      fVar214 = fVar197;
      fVar215 = fVar197;
      fVar216 = fVar197;
      fVar225 = fVar104;
      fVar232 = fVar104;
      fVar235 = fVar104;
      local_3e8 = fVar196;
      fStack_3e4 = fVar196;
      fStack_3e0 = fVar196;
      fStack_3dc = fVar196;
      fStack_3a4 = local_3a8;
      fStack_3a0 = local_3a8;
      fStack_39c = local_3a8;
      fStack_380 = fVar104;
      fStack_370 = fVar197;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_304 = local_308;
      fStack_300 = local_308;
      fStack_2fc = local_308;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      if (iVar51 == 0) {
        uVar61 = 0;
        local_388 = local_308;
        fStack_384 = local_3a8;
        local_378 = local_358;
        fStack_374 = local_368;
      }
      else {
        fVar70 = local_3d8 * fVar104 + fVar101 * fVar197 + fVar164 * fVar212 + fVar203 * fVar198;
        fVar100 = fStack_3d4 * fVar104 + fVar123 * fVar197 + fVar167 * fVar212 + fVar204 * fVar198;
        fVar102 = fStack_3d0 * fVar104 + fVar152 * fVar197 + fVar172 * fVar212 + fVar213 * fVar198;
        fVar103 = fStack_3cc * fVar104 + fVar153 * fVar197 + fVar202 * fVar212 + fVar217 * fVar198;
        local_398._0_4_ = auVar29._0_4_;
        local_398._4_4_ = auVar29._4_4_;
        fStack_390 = auVar29._8_4_;
        fVar105 = fVar131 * fVar104 + (float)local_398._0_4_ * fVar197 + local_348 * fVar212 +
                  local_258 * fVar198;
        fVar124 = fVar137 * fVar104 + (float)local_398._4_4_ * fVar197 + fStack_344 * fVar212 +
                  fStack_254 * fVar198;
        fVar127 = fVar139 * fVar104 + fStack_390 * fVar197 + fStack_340 * fVar212 +
                  fStack_250 * fVar198;
        fVar129 = fVar151 * fVar104 + fVar126 * fVar197 + fStack_33c * fVar212 +
                  fStack_24c * fVar198;
        fVar101 = *(float *)(catmullrom_basis0 + lVar22 + 0x1210);
        fVar123 = *(float *)(catmullrom_basis0 + lVar22 + 0x1214);
        fVar126 = *(float *)(catmullrom_basis0 + lVar22 + 0x1218);
        fVar131 = *(float *)(catmullrom_basis0 + lVar22 + 0x121c);
        fVar137 = *(float *)(catmullrom_basis0 + lVar22 + 0x1694);
        fVar139 = *(float *)(catmullrom_basis0 + lVar22 + 0x1698);
        fVar151 = *(float *)(catmullrom_basis0 + lVar22 + 0x169c);
        fVar152 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a0);
        fVar153 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b18);
        fVar164 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b1c);
        fVar167 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b20);
        fVar172 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b24);
        fVar202 = *(float *)(catmullrom_basis0 + lVar22 + 0x1f9c);
        fVar203 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa0);
        fVar204 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa4);
        fVar213 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa8);
        fVar226 = local_1b8 * fVar101 +
                  fVar196 * fVar137 + local_358 * fVar153 + local_308 * fVar202;
        fVar233 = local_1b8 * fVar123 +
                  fVar196 * fVar139 + local_358 * fVar164 + local_308 * fVar203;
        fVar236 = local_1b8 * fVar126 +
                  fVar196 * fVar151 + local_358 * fVar167 + local_308 * fVar204;
        fVar238 = local_1b8 * fVar131 +
                  fVar196 * fVar152 + local_358 * fVar172 + local_308 * fVar213;
        fVar284 = local_1c8 * fVar101 +
                  local_1d8 * fVar137 + local_368 * fVar153 + local_3a8 * fVar202;
        fVar285 = local_1c8 * fVar123 +
                  local_1d8 * fVar139 + local_368 * fVar164 + local_3a8 * fVar203;
        fVar287 = local_1c8 * fVar126 +
                  local_1d8 * fVar151 + local_368 * fVar167 + local_3a8 * fVar204;
        fVar289 = local_1c8 * fVar131 +
                  local_1d8 * fVar152 + local_368 * fVar172 + local_3a8 * fVar213;
        fVar217 = *(float *)(catmullrom_basis1 + lVar22 + 0x1210);
        fVar286 = *(float *)(catmullrom_basis1 + lVar22 + 0x1214);
        fVar288 = *(float *)(catmullrom_basis1 + lVar22 + 0x1218);
        fVar290 = *(float *)(catmullrom_basis1 + lVar22 + 0x121c);
        fVar227 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b18);
        fVar234 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b1c);
        fVar237 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b20);
        fVar239 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b24);
        fVar251 = *(float *)(catmullrom_basis1 + lVar22 + 0x1f9c);
        fVar260 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa0);
        fVar262 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa4);
        fVar264 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa8);
        fVar267 = *(float *)(catmullrom_basis1 + lVar22 + 0x1694);
        fVar273 = *(float *)(catmullrom_basis1 + lVar22 + 0x1698);
        fVar275 = *(float *)(catmullrom_basis1 + lVar22 + 0x169c);
        fVar277 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a0);
        auVar155._0_4_ = fVar196 * fVar267 + local_358 * fVar227 + local_308 * fVar251;
        auVar155._4_4_ = fVar196 * fVar273 + local_358 * fVar234 + local_308 * fVar260;
        auVar155._8_4_ = fVar196 * fVar275 + local_358 * fVar237 + local_308 * fVar262;
        auVar155._12_4_ = fVar196 * fVar277 + local_358 * fVar239 + local_308 * fVar264;
        fVar278 = local_1b8 * fVar217 + auVar155._0_4_;
        fVar281 = local_1b8 * fVar286 + auVar155._4_4_;
        fVar282 = local_1b8 * fVar288 + auVar155._8_4_;
        fVar283 = local_1b8 * fVar290 + auVar155._12_4_;
        fVar106 = local_1c8 * fVar217 +
                  local_1d8 * fVar267 + local_368 * fVar227 + local_3a8 * fVar251;
        fVar125 = local_1c8 * fVar286 +
                  local_1d8 * fVar273 + local_368 * fVar234 + local_3a8 * fVar260;
        fVar128 = local_1c8 * fVar288 +
                  local_1d8 * fVar275 + local_368 * fVar237 + local_3a8 * fVar262;
        fVar130 = local_1c8 * fVar290 +
                  local_1d8 * fVar277 + local_368 * fVar239 + local_3a8 * fVar264;
        auVar257._0_8_ = CONCAT44(fVar233,fVar226) & 0x7fffffff7fffffff;
        auVar257._8_4_ = ABS(fVar236);
        auVar257._12_4_ = ABS(fVar238);
        auVar26._8_4_ = ABS(fVar287);
        auVar26._0_8_ = CONCAT44(fVar285,fVar284) & 0x7fffffff7fffffff;
        auVar26._12_4_ = ABS(fVar289);
        auVar72 = maxps(auVar257,auVar26);
        auVar268._0_8_ =
             CONCAT44(fVar123 * fVar198 + fVar139 * fVar212 + fVar164 * fVar197 + fVar203 * fVar104,
                      fVar101 * fVar198 + fVar137 * fVar212 + fVar153 * fVar197 + fVar202 * fVar104)
             & 0x7fffffff7fffffff;
        auVar268._8_4_ =
             ABS(fVar126 * fVar198 + fVar151 * fVar212 + fVar167 * fVar197 + fVar204 * fVar104);
        auVar268._12_4_ =
             ABS(fVar131 * fVar198 + fVar152 * fVar212 + fVar172 * fVar197 + fVar213 * fVar104);
        auVar72 = maxps(auVar72,auVar268);
        uVar63 = -(uint)(local_2a8 <= auVar72._0_4_);
        uVar64 = -(uint)(local_2a8 <= auVar72._4_4_);
        uVar65 = -(uint)(local_2a8 <= auVar72._8_4_);
        uVar66 = -(uint)(local_2a8 <= auVar72._12_4_);
        fVar153 = (float)((uint)fVar226 & uVar63 | ~uVar63 & (uint)fVar276);
        fVar164 = (float)((uint)fVar233 & uVar64 | ~uVar64 & (uint)fVar166);
        fVar167 = (float)((uint)fVar236 & uVar65 | ~uVar65 & (uint)fVar169);
        fVar172 = (float)((uint)fVar238 & uVar66 | ~uVar66 & (uint)fVar171);
        fVar202 = (float)(~uVar63 & (uint)fVar240 | (uint)fVar284 & uVar63);
        fVar203 = (float)(~uVar64 & (uint)fVar248 | (uint)fVar285 & uVar64);
        fVar204 = (float)(~uVar65 & (uint)fVar250 | (uint)fVar287 & uVar65);
        fVar213 = (float)(~uVar66 & (uint)fVar261 | (uint)fVar289 & uVar66);
        auVar269._0_8_ = CONCAT44(fVar281,fVar278) & 0x7fffffff7fffffff;
        auVar269._8_4_ = ABS(fVar282);
        auVar269._12_4_ = ABS(fVar283);
        auVar222._0_8_ = CONCAT44(fVar125,fVar106) & 0x7fffffff7fffffff;
        auVar222._8_4_ = ABS(fVar128);
        auVar222._12_4_ = ABS(fVar130);
        auVar72 = maxps(auVar269,auVar222);
        auVar200._0_8_ =
             CONCAT44(fVar286 * fVar198 + fVar273 * fVar212 + fVar234 * fVar197 + fVar260 * fVar104,
                      fVar217 * fVar198 + fVar267 * fVar212 + fVar227 * fVar197 + fVar251 * fVar104)
             & 0x7fffffff7fffffff;
        auVar200._8_4_ =
             ABS(fVar288 * fVar198 + fVar275 * fVar212 + fVar237 * fVar197 + fVar262 * fVar104);
        auVar200._12_4_ =
             ABS(fVar290 * fVar198 + fVar277 * fVar212 + fVar239 * fVar197 + fVar264 * fVar104);
        auVar72 = maxps(auVar72,auVar200);
        uVar63 = -(uint)(local_2a8 <= auVar72._0_4_);
        uVar64 = -(uint)(local_2a8 <= auVar72._4_4_);
        uVar65 = -(uint)(local_2a8 <= auVar72._8_4_);
        uVar66 = -(uint)(local_2a8 <= auVar72._12_4_);
        fVar227 = (float)((uint)fVar278 & uVar63 | ~uVar63 & (uint)fVar276);
        fVar234 = (float)((uint)fVar281 & uVar64 | ~uVar64 & (uint)fVar166);
        fVar237 = (float)((uint)fVar282 & uVar65 | ~uVar65 & (uint)fVar169);
        fVar239 = (float)((uint)fVar283 & uVar66 | ~uVar66 & (uint)fVar171);
        fVar217 = (float)(~uVar63 & (uint)fVar240 | (uint)fVar106 & uVar63);
        fVar276 = (float)(~uVar64 & (uint)fVar248 | (uint)fVar125 & uVar64);
        fVar166 = (float)(~uVar65 & (uint)fVar250 | (uint)fVar128 & uVar65);
        fVar169 = (float)(~uVar66 & (uint)fVar261 | (uint)fVar130 & uVar66);
        auVar119._0_4_ = fVar202 * fVar202 + fVar153 * fVar153;
        auVar119._4_4_ = fVar203 * fVar203 + fVar164 * fVar164;
        auVar119._8_4_ = fVar204 * fVar204 + fVar167 * fVar167;
        auVar119._12_4_ = fVar213 * fVar213 + fVar172 * fVar172;
        auVar72 = rsqrtps(auVar155,auVar119);
        fVar101 = auVar72._0_4_;
        fVar123 = auVar72._4_4_;
        fVar126 = auVar72._8_4_;
        fVar131 = auVar72._12_4_;
        auVar156._0_4_ = fVar101 * fVar101 * auVar119._0_4_ * 0.5 * fVar101;
        auVar156._4_4_ = fVar123 * fVar123 * auVar119._4_4_ * 0.5 * fVar123;
        auVar156._8_4_ = fVar126 * fVar126 * auVar119._8_4_ * 0.5 * fVar126;
        auVar156._12_4_ = fVar131 * fVar131 * auVar119._12_4_ * 0.5 * fVar131;
        fVar171 = fVar101 * 1.5 - auVar156._0_4_;
        fVar286 = fVar123 * 1.5 - auVar156._4_4_;
        fVar288 = fVar126 * 1.5 - auVar156._8_4_;
        fVar290 = fVar131 * 1.5 - auVar156._12_4_;
        auVar120._0_4_ = fVar217 * fVar217 + fVar227 * fVar227;
        auVar120._4_4_ = fVar276 * fVar276 + fVar234 * fVar234;
        auVar120._8_4_ = fVar166 * fVar166 + fVar237 * fVar237;
        auVar120._12_4_ = fVar169 * fVar169 + fVar239 * fVar239;
        auVar72 = rsqrtps(auVar156,auVar120);
        fVar101 = auVar72._0_4_;
        fVar123 = auVar72._4_4_;
        fVar126 = auVar72._8_4_;
        fVar131 = auVar72._12_4_;
        fVar137 = fVar101 * 1.5 - fVar101 * fVar101 * auVar120._0_4_ * 0.5 * fVar101;
        fVar139 = fVar123 * 1.5 - fVar123 * fVar123 * auVar120._4_4_ * 0.5 * fVar123;
        fVar151 = fVar126 * 1.5 - fVar126 * fVar126 * auVar120._8_4_ * 0.5 * fVar126;
        fVar152 = fVar131 * 1.5 - fVar131 * fVar131 * auVar120._12_4_ * 0.5 * fVar131;
        fVar251 = fVar202 * fVar171 * (float)local_3c8._0_4_;
        fVar260 = fVar203 * fVar286 * local_3c8._4_4_;
        fVar262 = fVar204 * fVar288 * local_3c8._8_4_;
        fVar264 = fVar213 * fVar290 * local_3c8._12_4_;
        fVar101 = -fVar153 * fVar171 * (float)local_3c8._0_4_;
        fVar123 = -fVar164 * fVar286 * local_3c8._4_4_;
        fVar126 = -fVar167 * fVar288 * local_3c8._8_4_;
        fVar131 = -fVar172 * fVar290 * local_3c8._12_4_;
        local_258 = fVar247 + fVar101;
        fStack_254 = fVar249 + fVar123;
        fStack_250 = fVar259 + fVar126;
        fStack_24c = fVar263 + fVar131;
        fVar106 = fVar171 * 0.0 * (float)local_3c8._0_4_;
        fVar125 = fVar286 * 0.0 * local_3c8._4_4_;
        fVar128 = fVar288 * 0.0 * local_3c8._8_4_;
        fVar130 = fVar290 * 0.0 * local_3c8._12_4_;
        local_348 = fVar105 + fVar106;
        fStack_344 = fVar124 + fVar125;
        fStack_340 = fVar127 + fVar128;
        fStack_33c = fVar129 + fVar130;
        fVar267 = fVar217 * fVar137 * auVar210._0_4_;
        fVar273 = fVar276 * fVar139 * auVar210._4_4_;
        fVar275 = fVar166 * fVar151 * auVar210._8_4_;
        fVar277 = fVar169 * fVar152 * auVar210._12_4_;
        fVar171 = fVar274 + fVar267;
        fVar286 = fVar165 + fVar273;
        fVar288 = fVar168 + fVar275;
        fVar290 = fVar170 + fVar277;
        fVar202 = -fVar227 * fVar137 * auVar210._0_4_;
        fVar203 = -fVar234 * fVar139 * auVar210._4_4_;
        fVar204 = -fVar237 * fVar151 * auVar210._8_4_;
        fVar213 = -fVar239 * fVar152 * auVar210._12_4_;
        fVar217 = fVar266 + fVar202;
        fVar276 = fVar272 + fVar203;
        fVar166 = fStack_3b0 + fVar204;
        fVar169 = fStack_3ac + fVar213;
        fVar153 = fVar137 * 0.0 * auVar210._0_4_;
        fVar164 = fVar139 * 0.0 * auVar210._4_4_;
        fVar167 = fVar151 * 0.0 * auVar210._8_4_;
        fVar172 = fVar152 * 0.0 * auVar210._12_4_;
        fVar137 = (float)local_338._0_4_ - fVar251;
        fVar139 = (float)local_338._4_4_ - fVar260;
        fVar151 = (float)uStack_330 - fVar262;
        fVar152 = uStack_330._4_4_ - fVar264;
        fVar227 = fVar70 + fVar153;
        fVar234 = fVar100 + fVar164;
        fVar237 = fVar102 + fVar167;
        fVar239 = fVar103 + fVar172;
        fVar247 = fVar247 - fVar101;
        fVar249 = fVar249 - fVar123;
        fVar259 = fVar259 - fVar126;
        fVar263 = fVar263 - fVar131;
        fVar105 = fVar105 - fVar106;
        fVar124 = fVar124 - fVar125;
        fVar127 = fVar127 - fVar128;
        fVar129 = fVar129 - fVar130;
        uVar63 = -(uint)(0.0 < (fVar247 * (fVar227 - fVar105) - fVar105 * (fVar217 - fVar247)) * 0.0
                               + (fVar105 * (fVar171 - fVar137) - (fVar227 - fVar105) * fVar137) *
                                 0.0 + ((fVar217 - fVar247) * fVar137 -
                                       (fVar171 - fVar137) * fVar247));
        uVar64 = -(uint)(0.0 < (fVar249 * (fVar234 - fVar124) - fVar124 * (fVar276 - fVar249)) * 0.0
                               + (fVar124 * (fVar286 - fVar139) - (fVar234 - fVar124) * fVar139) *
                                 0.0 + ((fVar276 - fVar249) * fVar139 -
                                       (fVar286 - fVar139) * fVar249));
        uVar65 = -(uint)(0.0 < (fVar259 * (fVar237 - fVar127) - fVar127 * (fVar166 - fVar259)) * 0.0
                               + (fVar127 * (fVar288 - fVar151) - (fVar237 - fVar127) * fVar151) *
                                 0.0 + ((fVar166 - fVar259) * fVar151 -
                                       (fVar288 - fVar151) * fVar259));
        uVar66 = -(uint)(0.0 < (fVar263 * (fVar239 - fVar129) - fVar129 * (fVar169 - fVar263)) * 0.0
                               + (fVar129 * (fVar290 - fVar152) - (fVar239 - fVar129) * fVar152) *
                                 0.0 + ((fVar169 - fVar263) * fVar152 -
                                       (fVar290 - fVar152) * fVar263));
        fVar106 = (float)((uint)(fVar274 - fVar267) & uVar63 |
                         ~uVar63 & (uint)((float)local_338._0_4_ + fVar251));
        fVar125 = (float)((uint)(fVar165 - fVar273) & uVar64 |
                         ~uVar64 & (uint)((float)local_338._4_4_ + fVar260));
        fVar275 = (float)((uint)(fVar168 - fVar275) & uVar65 |
                         ~uVar65 & (uint)((float)uStack_330 + fVar262));
        fVar277 = (float)((uint)(fVar170 - fVar277) & uVar66 |
                         ~uVar66 & (uint)(uStack_330._4_4_ + fVar264));
        fVar251 = (float)((uint)(fVar266 - fVar202) & uVar63 | ~uVar63 & (uint)local_258);
        fVar260 = (float)((uint)(fVar272 - fVar203) & uVar64 | ~uVar64 & (uint)fStack_254);
        fStack_3b0 = (float)((uint)(fStack_3b0 - fVar204) & uVar65 | ~uVar65 & (uint)fStack_250);
        fStack_3ac = (float)((uint)(fStack_3ac - fVar213) & uVar66 | ~uVar66 & (uint)fStack_24c);
        fVar153 = (float)((uint)(fVar70 - fVar153) & uVar63 | ~uVar63 & (uint)local_348);
        fVar164 = (float)((uint)(fVar100 - fVar164) & uVar64 | ~uVar64 & (uint)fStack_344);
        fVar167 = (float)((uint)(fVar102 - fVar167) & uVar65 | ~uVar65 & (uint)fStack_340);
        fVar172 = (float)((uint)(fVar103 - fVar172) & uVar66 | ~uVar66 & (uint)fStack_33c);
        fVar202 = (float)((uint)fVar137 & uVar63 | ~uVar63 & (uint)fVar171);
        fVar203 = (float)((uint)fVar139 & uVar64 | ~uVar64 & (uint)fVar286);
        fVar204 = (float)((uint)fVar151 & uVar65 | ~uVar65 & (uint)fVar288);
        fVar213 = (float)((uint)fVar152 & uVar66 | ~uVar66 & (uint)fVar290);
        fVar101 = (float)((uint)fVar247 & uVar63 | ~uVar63 & (uint)fVar217);
        fVar123 = (float)((uint)fVar249 & uVar64 | ~uVar64 & (uint)fVar276);
        fVar126 = (float)((uint)fVar259 & uVar65 | ~uVar65 & (uint)fVar166);
        fVar131 = (float)((uint)fVar263 & uVar66 | ~uVar66 & (uint)fVar169);
        fVar262 = (float)((uint)fVar105 & uVar63 | ~uVar63 & (uint)fVar227);
        fVar264 = (float)((uint)fVar124 & uVar64 | ~uVar64 & (uint)fVar234);
        fVar267 = (float)((uint)fVar127 & uVar65 | ~uVar65 & (uint)fVar237);
        fVar273 = (float)((uint)fVar129 & uVar66 | ~uVar66 & (uint)fVar239);
        fVar165 = (float)((uint)fVar171 & uVar63 | ~uVar63 & (uint)fVar137) - fVar106;
        fVar168 = (float)((uint)fVar286 & uVar64 | ~uVar64 & (uint)fVar139) - fVar125;
        fVar170 = (float)((uint)fVar288 & uVar65 | ~uVar65 & (uint)fVar151) - fVar275;
        fVar171 = (float)((uint)fVar290 & uVar66 | ~uVar66 & (uint)fVar152) - fVar277;
        fVar217 = (float)((uint)fVar217 & uVar63 | ~uVar63 & (uint)fVar247) - fVar251;
        fVar247 = (float)((uint)fVar276 & uVar64 | ~uVar64 & (uint)fVar249) - fVar260;
        fVar249 = (float)((uint)fVar166 & uVar65 | ~uVar65 & (uint)fVar259) - fStack_3b0;
        fVar259 = (float)((uint)fVar169 & uVar66 | ~uVar66 & (uint)fVar263) - fStack_3ac;
        local_3d8 = (float)((uint)fVar227 & uVar63 | ~uVar63 & (uint)fVar105) - fVar153;
        fStack_3d4 = (float)((uint)fVar234 & uVar64 | ~uVar64 & (uint)fVar124) - fVar164;
        fStack_3d0 = (float)((uint)fVar237 & uVar65 | ~uVar65 & (uint)fVar127) - fVar167;
        fStack_3cc = (float)((uint)fVar239 & uVar66 | ~uVar66 & (uint)fVar129) - fVar172;
        fVar288 = fVar106 - fVar202;
        fVar290 = fVar125 - fVar203;
        fVar227 = fVar275 - fVar204;
        fVar234 = fVar277 - fVar213;
        fVar263 = fVar251 - fVar101;
        fVar266 = fVar260 - fVar123;
        fVar272 = fStack_3b0 - fVar126;
        fVar274 = fStack_3ac - fVar131;
        local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar260,fVar251);
        fVar137 = fVar153 - fVar262;
        fVar139 = fVar164 - fVar264;
        fVar151 = fVar167 - fVar267;
        fVar152 = fVar172 - fVar273;
        fVar276 = (fVar251 * local_3d8 - fVar153 * fVar217) * 0.0 +
                  (fVar153 * fVar165 - fVar106 * local_3d8) * 0.0 +
                  (fVar106 * fVar217 - fVar251 * fVar165);
        fVar166 = (fVar260 * fStack_3d4 - fVar164 * fVar247) * 0.0 +
                  (fVar164 * fVar168 - fVar125 * fStack_3d4) * 0.0 +
                  (fVar125 * fVar247 - fVar260 * fVar168);
        auVar147._4_4_ = fVar166;
        auVar147._0_4_ = fVar276;
        fVar169 = (fStack_3b0 * fStack_3d0 - fVar167 * fVar249) * 0.0 +
                  (fVar167 * fVar170 - fVar275 * fStack_3d0) * 0.0 +
                  (fVar275 * fVar249 - fStack_3b0 * fVar170);
        fVar286 = (fStack_3ac * fStack_3cc - fVar172 * fVar259) * 0.0 +
                  (fVar172 * fVar171 - fVar277 * fStack_3cc) * 0.0 +
                  (fVar277 * fVar259 - fStack_3ac * fVar171);
        auVar279._0_4_ =
             (fVar101 * fVar137 - fVar262 * fVar263) * 0.0 +
             (fVar262 * fVar288 - fVar202 * fVar137) * 0.0 + (fVar202 * fVar263 - fVar101 * fVar288)
        ;
        auVar279._4_4_ =
             (fVar123 * fVar139 - fVar264 * fVar266) * 0.0 +
             (fVar264 * fVar290 - fVar203 * fVar139) * 0.0 + (fVar203 * fVar266 - fVar123 * fVar290)
        ;
        auVar279._8_4_ =
             (fVar126 * fVar151 - fVar267 * fVar272) * 0.0 +
             (fVar267 * fVar227 - fVar204 * fVar151) * 0.0 + (fVar204 * fVar272 - fVar126 * fVar227)
        ;
        auVar279._12_4_ =
             (fVar131 * fVar152 - fVar273 * fVar274) * 0.0 +
             (fVar273 * fVar234 - fVar213 * fVar152) * 0.0 + (fVar213 * fVar274 - fVar131 * fVar234)
        ;
        auVar147._8_4_ = fVar169;
        auVar147._12_4_ = fVar286;
        auVar72 = maxps(auVar147,auVar279);
        bVar25 = auVar72._0_4_ <= 0.0 && bVar25;
        auVar148._0_4_ = -(uint)bVar25;
        bVar50 = auVar72._4_4_ <= 0.0 && bVar50;
        auVar148._4_4_ = -(uint)bVar50;
        bVar24 = auVar72._8_4_ <= 0.0 && bVar24;
        auVar148._8_4_ = -(uint)bVar24;
        bVar23 = auVar72._12_4_ <= 0.0 && bVar23;
        auVar148._12_4_ = -(uint)bVar23;
        iVar51 = movmskps(iVar51,auVar148);
        if (iVar51 == 0) {
LAB_00c2c225:
          iVar51 = 0;
          auVar94._8_8_ = uStack_2d0;
          auVar94._0_8_ = local_2d8;
        }
        else {
          fVar101 = ray->tfar;
          auVar157._0_4_ = fVar137 * fVar217;
          auVar157._4_4_ = fVar139 * fVar247;
          auVar157._8_4_ = fVar151 * fVar249;
          auVar157._12_4_ = fVar152 * fVar259;
          fVar203 = fVar263 * local_3d8 - auVar157._0_4_;
          fVar204 = fVar266 * fStack_3d4 - auVar157._4_4_;
          fVar213 = fVar272 * fStack_3d0 - auVar157._8_4_;
          fVar237 = fVar274 * fStack_3cc - auVar157._12_4_;
          fVar123 = fVar137 * fVar165 - local_3d8 * fVar288;
          fVar131 = fVar139 * fVar168 - fStack_3d4 * fVar290;
          fVar139 = fVar151 * fVar170 - fStack_3d0 * fVar227;
          fVar152 = fVar152 * fVar171 - fStack_3cc * fVar234;
          fVar217 = fVar288 * fVar217 - fVar263 * fVar165;
          fVar247 = fVar290 * fVar247 - fVar266 * fVar168;
          fVar249 = fVar227 * fVar249 - fVar272 * fVar170;
          fVar259 = fVar234 * fVar259 - fVar274 * fVar171;
          auVar191._0_4_ = fVar203 * 0.0 + fVar123 * 0.0 + fVar217;
          auVar191._4_4_ = fVar204 * 0.0 + fVar131 * 0.0 + fVar247;
          auVar191._8_4_ = fVar213 * 0.0 + fVar139 * 0.0 + fVar249;
          auVar191._12_4_ = fVar237 * 0.0 + fVar152 * 0.0 + fVar259;
          auVar72 = rcpps(auVar157,auVar191);
          fVar126 = auVar72._0_4_;
          fVar137 = auVar72._4_4_;
          fVar151 = auVar72._8_4_;
          fVar202 = auVar72._12_4_;
          fVar126 = (1.0 - auVar191._0_4_ * fVar126) * fVar126 + fVar126;
          fVar137 = (1.0 - auVar191._4_4_ * fVar137) * fVar137 + fVar137;
          fVar151 = (1.0 - auVar191._8_4_ * fVar151) * fVar151 + fVar151;
          fVar202 = (1.0 - auVar191._12_4_ * fVar202) * fVar202 + fVar202;
          fVar123 = (fVar153 * fVar217 + fVar251 * fVar123 + fVar106 * fVar203) * fVar126;
          fVar131 = (fVar164 * fVar247 + fVar260 * fVar131 + fVar125 * fVar204) * fVar137;
          fVar139 = (fVar167 * fVar249 + fStack_3b0 * fVar139 + fVar275 * fVar213) * fVar151;
          fVar152 = (fVar172 * fVar259 + fStack_3ac * fVar152 + fVar277 * fVar237) * fVar202;
          bVar25 = (fVar123 <= fVar101 && fVar69 <= fVar123) && bVar25;
          auVar158._0_4_ = -(uint)bVar25;
          bVar50 = (fVar131 <= fVar101 && fVar69 <= fVar131) && bVar50;
          auVar158._4_4_ = -(uint)bVar50;
          bVar24 = (fVar139 <= fVar101 && fVar69 <= fVar139) && bVar24;
          auVar158._8_4_ = -(uint)bVar24;
          bVar23 = (fVar152 <= fVar101 && fVar69 <= fVar152) && bVar23;
          auVar158._12_4_ = -(uint)bVar23;
          iVar51 = movmskps(iVar51,auVar158);
          if (iVar51 == 0) goto LAB_00c2c225;
          auVar159._0_8_ =
               CONCAT44(-(uint)(auVar191._4_4_ != 0.0 && bVar50),
                        -(uint)(auVar191._0_4_ != 0.0 && bVar25));
          auVar159._8_4_ = -(uint)(auVar191._8_4_ != 0.0 && bVar24);
          auVar159._12_4_ = -(uint)(auVar191._12_4_ != 0.0 && bVar23);
          iVar51 = movmskps(iVar51,auVar159);
          auVar94._8_8_ = uStack_2d0;
          auVar94._0_8_ = local_2d8;
          if (iVar51 != 0) {
            fVar276 = fVar276 * fVar126;
            fVar166 = fVar166 * fVar137;
            fVar169 = fVar169 * fVar151;
            fVar286 = fVar286 * fVar202;
            local_2b8 = (float)((uint)(1.0 - fVar276) & uVar63 | ~uVar63 & (uint)fVar276);
            fStack_2b4 = (float)((uint)(1.0 - fVar166) & uVar64 | ~uVar64 & (uint)fVar166);
            fStack_2b0 = (float)((uint)(1.0 - fVar169) & uVar65 | ~uVar65 & (uint)fVar169);
            fStack_2ac = (float)((uint)(1.0 - fVar286) & uVar66 | ~uVar66 & (uint)fVar286);
            local_198 = (float)(~uVar63 & (uint)(auVar279._0_4_ * fVar126) |
                               (uint)(1.0 - auVar279._0_4_ * fVar126) & uVar63);
            fStack_194 = (float)(~uVar64 & (uint)(auVar279._4_4_ * fVar137) |
                                (uint)(1.0 - auVar279._4_4_ * fVar137) & uVar64);
            fStack_190 = (float)(~uVar65 & (uint)(auVar279._8_4_ * fVar151) |
                                (uint)(1.0 - auVar279._8_4_ * fVar151) & uVar65);
            fStack_18c = (float)(~uVar66 & (uint)(auVar279._12_4_ * fVar202) |
                                (uint)(1.0 - auVar279._12_4_ * fVar202) & uVar66);
            auVar94._8_4_ = auVar159._8_4_;
            auVar94._0_8_ = auVar159._0_8_;
            auVar94._12_4_ = auVar159._12_4_;
            local_2c8 = fVar123;
            fStack_2c4 = fVar131;
            fStack_2c0 = fVar139;
            fStack_2bc = fVar152;
          }
        }
        iVar51 = movmskps(iVar51,auVar94);
        _local_3f8 = auVar210;
        _local_398 = auVar190;
        local_388 = fVar104;
        fStack_384 = fVar104;
        fStack_37c = fVar104;
        local_378 = fVar197;
        fStack_374 = fVar197;
        fStack_36c = fVar197;
        local_188 = fVar240;
        fStack_184 = fVar248;
        fStack_180 = fVar250;
        fStack_17c = fVar261;
        if (iVar51 == 0) {
          uVar61 = 0;
        }
        else {
          fVar101 = (auVar210._0_4_ - (float)local_3c8._0_4_) * local_2b8 + (float)local_3c8._0_4_;
          fVar123 = (auVar210._4_4_ - local_3c8._4_4_) * fStack_2b4 + local_3c8._4_4_;
          fVar126 = (auVar210._8_4_ - local_3c8._8_4_) * fStack_2b0 + local_3c8._8_4_;
          fVar131 = (auVar210._12_4_ - local_3c8._12_4_) * fStack_2ac + local_3c8._12_4_;
          fVar69 = local_2f0->depth_scale;
          auVar121._0_4_ = -(uint)(fVar69 * (fVar101 + fVar101) < local_2c8) & auVar94._0_4_;
          auVar121._4_4_ = -(uint)(fVar69 * (fVar123 + fVar123) < fStack_2c4) & auVar94._4_4_;
          auVar121._8_4_ = -(uint)(fVar69 * (fVar126 + fVar126) < fStack_2c0) & auVar94._8_4_;
          auVar121._12_4_ = -(uint)(fVar69 * (fVar131 + fVar131) < fStack_2bc) & auVar94._12_4_;
          uVar63 = movmskps((int)local_2f0,auVar121);
          if (uVar63 != 0) {
            local_198 = local_198 + local_198 + -1.0;
            fStack_194 = fStack_194 + fStack_194 + -1.0;
            fStack_190 = fStack_190 + fStack_190 + -1.0;
            fStack_18c = fStack_18c + fStack_18c + -1.0;
            local_148 = 0;
            local_138 = CONCAT44(fStack_1f4,local_1f8);
            uStack_130 = CONCAT44(fStack_1ec,fStack_1f0);
            local_128 = CONCAT44(fStack_84,local_88);
            uStack_120 = CONCAT44(fStack_7c,fStack_80);
            local_118 = CONCAT44(fStack_94,local_98);
            uStack_110 = CONCAT44(fStack_8c,fStack_90);
            local_108 = CONCAT44(fStack_74,local_78);
            uStack_100 = CONCAT44(fStack_6c,fStack_70);
            pRVar56 = (RTCIntersectArguments *)(ulong)(uint)ray->mask;
            local_178 = local_2b8;
            fStack_174 = fStack_2b4;
            fStack_170 = fStack_2b0;
            fStack_16c = fStack_2ac;
            local_168 = local_198;
            fStack_164 = fStack_194;
            fStack_160 = fStack_190;
            fStack_15c = fStack_18c;
            local_158 = local_2c8;
            fStack_154 = fStack_2c4;
            fStack_150 = fStack_2c0;
            fStack_14c = fStack_2bc;
            local_144 = fVar138;
            local_f8 = auVar121;
            if ((pGVar19->mask & ray->mask) != 0) {
              pRVar56 = context->args;
              if ((pRVar56->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar61 = CONCAT71((int7)(uVar61 >> 8),1),
                 pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar99 = 1.0 / fVar99;
                local_e8[0] = fVar99 * (local_2b8 + 0.0);
                local_e8[1] = fVar99 * (fStack_2b4 + 1.0);
                local_e8[2] = fVar99 * (fStack_2b0 + 2.0);
                local_e8[3] = fVar99 * (fStack_2ac + 3.0);
                local_d8 = CONCAT44(fStack_194,local_198);
                uStack_d0 = CONCAT44(fStack_18c,fStack_190);
                local_c8[0] = local_2c8;
                local_c8[1] = fStack_2c4;
                local_c8[2] = fStack_2c0;
                local_c8[3] = fStack_2bc;
                auVar59 = (undefined1  [8])(ulong)(uVar63 & 0xff);
                pRVar56 = (RTCIntersectArguments *)0x0;
                if (auVar59 != (undefined1  [8])0x0) {
                  for (; ((uVar63 & 0xff) >> (long)pRVar56 & 1) == 0;
                      pRVar56 = (RTCIntersectArguments *)((long)&pRVar56->flags + 1)) {
                  }
                }
                uStack_3f0 = uStack_120;
                local_3f8 = (undefined1  [8])local_128;
                uVar61 = CONCAT71((int7)(uVar61 >> 8),1);
                local_328 = local_108;
                uStack_320 = uStack_100;
                local_318 = local_118;
                uStack_310 = uStack_110;
                do {
                  local_23c = local_e8[(long)pRVar56];
                  local_238 = *(undefined4 *)((long)&local_d8 + (long)pRVar56 * 4);
                  local_3c8._0_4_ = ray->tfar;
                  ray->tfar = local_c8[(long)pRVar56];
                  fVar69 = 1.0 - local_23c;
                  fVar101 = local_23c * 3.0;
                  fVar123 = ((fVar101 + 2.0) * (fVar69 + fVar69) + fVar69 * -3.0 * fVar69) * 0.5;
                  fVar99 = (fVar69 * -2.0 * local_23c + local_23c * local_23c) * 0.5;
                  fVar101 = (local_23c * fVar101 + (fVar101 + -5.0) * (local_23c + local_23c)) * 0.5
                  ;
                  fVar69 = (local_23c * (fVar69 + fVar69) - fVar69 * fVar69) * 0.5;
                  local_248 = CONCAT44(fVar69 * fStack_1f4 +
                                       fVar101 * (float)local_3f8._4_4_ +
                                       fVar123 * local_318._4_4_ + fVar99 * local_328._4_4_,
                                       fVar69 * local_1f8 +
                                       fVar101 * (float)local_3f8._0_4_ +
                                       fVar123 * (float)local_318 + fVar99 * (float)local_328);
                  local_240 = fVar69 * fStack_1f0 +
                              fVar101 * (float)uStack_3f0 +
                              fVar123 * (float)uStack_310 + fVar99 * (float)uStack_320;
                  local_298.context = context->user;
                  local_234 = (undefined4)local_210;
                  local_230 = (undefined4)local_2f8;
                  local_22c = (local_298.context)->instID[0];
                  local_228 = (local_298.context)->instPrimID[0];
                  local_3fc = -1;
                  local_298.valid = &local_3fc;
                  local_298.geometryUserPtr = pGVar19->userPtr;
                  local_298.hit = (RTCHitN *)&local_248;
                  local_298.N = 1;
                  local_3d8 = (float)uVar61;
                  local_3b8 = pRVar56;
                  local_298.ray = (RTCRayN *)ray;
                  if (pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c2b1ff:
                    pRVar56 = context->args;
                    if (pRVar56->filter == (RTCFilterFunctionN)0x0) break;
                    if (((pRVar56->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                      (*pRVar56->filter)(&local_298);
                      uVar61 = (ulong)(uint)local_3d8;
                      fVar196 = local_3e8;
                      fVar223 = fStack_3e4;
                      fVar224 = fStack_3e0;
                      fVar265 = fStack_3dc;
                      fVar197 = local_378;
                      fVar214 = fStack_374;
                      fVar215 = fStack_370;
                      fVar216 = fStack_36c;
                      fVar104 = local_388;
                      fVar225 = fStack_384;
                      fVar232 = fStack_380;
                      fVar235 = fStack_37c;
                    }
                    if (*local_298.valid != 0) break;
                  }
                  else {
                    (*pGVar19->occlusionFilterN)(&local_298);
                    uVar61 = (ulong)(uint)local_3d8;
                    fVar196 = local_3e8;
                    fVar223 = fStack_3e4;
                    fVar224 = fStack_3e0;
                    fVar265 = fStack_3dc;
                    fVar197 = local_378;
                    fVar214 = fStack_374;
                    fVar215 = fStack_370;
                    fVar216 = fStack_36c;
                    fVar104 = local_388;
                    fVar225 = fStack_384;
                    fVar232 = fStack_380;
                    fVar235 = fStack_37c;
                    if (*local_298.valid != 0) goto LAB_00c2b1ff;
                  }
                  ray->tfar = (float)local_3c8._0_4_;
                  auVar59 = (undefined1  [8])((ulong)auVar59 ^ 1L << ((ulong)local_3b8 & 0x3f));
                  pRVar56 = (RTCIntersectArguments *)0x0;
                  if (auVar59 != (undefined1  [8])0x0) {
                    for (; ((ulong)auVar59 >> (long)pRVar56 & 1) == 0;
                        pRVar56 = (RTCIntersectArguments *)((long)&pRVar56->flags + 1)) {
                    }
                  }
                  uVar61 = CONCAT71((int7)(uVar61 >> 8),auVar59 != (undefined1  [8])0x0);
                } while (auVar59 != (undefined1  [8])0x0);
                uVar61 = uVar61 & 0xffffffffffffff01;
              }
              goto LAB_00c2b2f9;
            }
          }
          uVar61 = 0;
        }
      }
LAB_00c2b2f9:
      uVar54 = SUB84(pRVar56,0);
      if (4 < (int)fVar138) {
        local_1e8._4_4_ = local_1e8._0_4_;
        fStack_1e0 = (float)local_1e8._0_4_;
        fStack_1dc = (float)local_1e8._0_4_;
        local_208._4_4_ = 1.0 / (float)local_208._0_4_;
        local_208._0_4_ = local_208._4_4_;
        fStack_200 = (float)local_208._4_4_;
        fStack_1fc = (float)local_208._4_4_;
        lVar58 = 4;
        fStack_2a4 = local_2a8;
        fStack_2a0 = local_2a8;
        fStack_29c = local_2a8;
        local_388 = fVar104;
        fStack_384 = fVar225;
        fStack_380 = fVar232;
        fStack_37c = fVar235;
        local_378 = fVar197;
        fStack_374 = fVar214;
        fStack_370 = fVar215;
        fStack_36c = fVar216;
        local_188 = fVar138;
        fStack_184 = fVar138;
        fStack_180 = fVar138;
        fStack_17c = fVar138;
        do {
          uVar63 = (uint)lVar58;
          bVar23 = (int)(uVar63 | 1) < (int)fStack_184;
          bVar24 = (int)(uVar63 | 2) < (int)fStack_180;
          fStack_3b0 = (float)-(uint)bVar24;
          bVar25 = (int)(uVar63 | 3) < (int)fStack_17c;
          fStack_3ac = (float)-(uint)bVar25;
          local_3b8 = (RTCIntersectArguments *)
                      CONCAT44(-(uint)bVar23,-(uint)((int)uVar63 < (int)local_188));
          pRVar56 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar22);
          pRVar7 = &pRVar56->flags + lVar58;
          fVar69 = (float)*pRVar7;
          fVar99 = (float)pRVar7[1];
          fVar101 = (float)pRVar7[2];
          auVar31 = *(undefined1 (*) [12])pRVar7;
          fVar104 = *(float *)*(undefined1 (*) [12])(pRVar7 + 3);
          pauVar9 = (undefined1 (*) [16])(lVar22 + 0x22307f0 + lVar58 * 4);
          fVar123 = *(float *)*pauVar9;
          fVar126 = *(float *)(*pauVar9 + 4);
          fVar131 = *(float *)(*pauVar9 + 8);
          auVar30 = *(undefined1 (*) [12])*pauVar9;
          fVar137 = *(float *)(*pauVar9 + 0xc);
          _local_398 = *pauVar9;
          pfVar1 = (float *)(lVar22 + 0x2230c74 + lVar58 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pauVar9 = (undefined1 (*) [16])(lVar22 + 0x22310f8 + lVar58 * 4);
          fVar139 = *(float *)*pauVar9;
          fVar151 = *(float *)(*pauVar9 + 4);
          fVar152 = *(float *)(*pauVar9 + 8);
          auVar29 = *(undefined1 (*) [12])*pauVar9;
          fVar153 = *(float *)(*pauVar9 + 0xc);
          fVar213 = local_1b8 * fVar69 +
                    fVar196 * fVar123 + local_358 * local_348 + local_308 * fVar139;
          fVar217 = fStack_1b4 * fVar99 +
                    fVar223 * fVar126 + fStack_354 * fStack_344 + fStack_304 * fVar151;
          fVar214 = fStack_1b0 * fVar101 +
                    fVar224 * fVar131 + fStack_350 * fStack_340 + fStack_300 * fVar152;
          fVar215 = fStack_1ac * fVar104 +
                    fVar265 * fVar137 + fStack_34c * fStack_33c + fStack_2fc * fVar153;
          fVar216 = local_1c8 * fVar69 +
                    local_1d8 * fVar123 + local_368 * local_348 + local_3a8 * fVar139;
          fVar232 = fStack_1c4 * fVar99 +
                    fStack_1d4 * fVar126 + fStack_364 * fStack_344 + fStack_3a4 * fVar151;
          fVar240 = fStack_1c0 * fVar101 +
                    fStack_1d0 * fVar131 + fStack_360 * fStack_340 + fStack_3a0 * fVar152;
          fVar248 = fStack_1bc * fVar104 +
                    fStack_1cc * fVar137 + fStack_35c * fStack_33c + fStack_39c * fVar153;
          local_3c8._0_4_ =
               local_b8 * fVar69 + local_a8 * fVar123 + local_68 * local_348 + local_58 * fVar139;
          local_3c8._4_4_ =
               fStack_b4 * fVar99 +
               fStack_a4 * fVar126 + fStack_64 * fStack_344 + fStack_54 * fVar151;
          local_3c8._8_4_ =
               fStack_b0 * fVar101 +
               fStack_a0 * fVar131 + fStack_60 * fStack_340 + fStack_50 * fVar152;
          local_3c8._12_4_ =
               fStack_ac * fVar104 +
               fStack_9c * fVar137 + fStack_5c * fStack_33c + fStack_4c * fVar153;
          pfVar1 = (float *)(catmullrom_basis1 + lVar22 + lVar58 * 4);
          fVar69 = *pfVar1;
          fVar99 = pfVar1[1];
          fVar101 = pfVar1[2];
          fVar123 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2232c10 + lVar58 * 4);
          fVar126 = *pfVar1;
          fVar131 = pfVar1[1];
          fVar139 = pfVar1[2];
          fVar151 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233094 + lVar58 * 4);
          fVar152 = *pfVar1;
          fVar164 = pfVar1[1];
          fVar167 = pfVar1[2];
          fVar172 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2233518 + lVar58 * 4);
          fVar197 = *pfVar1;
          fVar202 = pfVar1[1];
          fVar203 = pfVar1[2];
          fVar204 = pfVar1[3];
          fVar266 = local_1b8 * fVar69 +
                    fVar196 * fVar126 + local_358 * fVar152 + local_308 * fVar197;
          fVar272 = fStack_1b4 * fVar99 +
                    fVar223 * fVar131 + fStack_354 * fVar164 + fStack_304 * fVar202;
          fVar274 = fStack_1b0 * fVar101 +
                    fVar224 * fVar139 + fStack_350 * fVar167 + fStack_300 * fVar203;
          fVar276 = fStack_1ac * fVar123 +
                    fVar265 * fVar151 + fStack_34c * fVar172 + fStack_2fc * fVar204;
          local_3d8 = local_1c8 * fVar69 +
                      local_1d8 * fVar126 + local_368 * fVar152 + local_3a8 * fVar197;
          fStack_3d4 = fStack_1c4 * fVar99 +
                       fStack_1d4 * fVar131 + fStack_364 * fVar164 + fStack_3a4 * fVar202;
          fStack_3d0 = fStack_1c0 * fVar101 +
                       fStack_1d0 * fVar139 + fStack_360 * fVar167 + fStack_3a0 * fVar203;
          fStack_3cc = fStack_1bc * fVar123 +
                       fStack_1cc * fVar151 + fStack_35c * fVar172 + fStack_39c * fVar204;
          auVar192._0_4_ =
               local_b8 * fVar69 + local_a8 * fVar126 + local_68 * fVar152 + local_58 * fVar197;
          auVar192._4_4_ =
               fStack_b4 * fVar99 + fStack_a4 * fVar131 + fStack_64 * fVar164 + fStack_54 * fVar202;
          auVar192._8_4_ =
               fStack_b0 * fVar101 + fStack_a0 * fVar139 + fStack_60 * fVar167 + fStack_50 * fVar203
          ;
          auVar192._12_4_ =
               fStack_ac * fVar123 + fStack_9c * fVar151 + fStack_5c * fVar172 + fStack_4c * fVar204
          ;
          fVar196 = fVar266 - fVar213;
          fVar223 = fVar272 - fVar217;
          fVar224 = fVar274 - fVar214;
          fVar265 = fVar276 - fVar215;
          fVar250 = local_3d8 - fVar216;
          fVar259 = fStack_3d4 - fVar232;
          fVar261 = fStack_3d0 - fVar240;
          fVar263 = fStack_3cc - fVar248;
          local_328 = CONCAT44(fVar232,fVar216);
          uStack_320 = CONCAT44(fVar248,fVar240);
          local_318 = CONCAT44(fVar217,fVar213);
          uStack_310 = CONCAT44(fVar215,fVar214);
          fVar225 = fVar216 * fVar196 - fVar213 * fVar250;
          fVar235 = fVar232 * fVar223 - fVar217 * fVar259;
          fVar247 = fVar240 * fVar224 - fVar214 * fVar261;
          fVar249 = fVar248 * fVar265 - fVar215 * fVar263;
          auVar72 = maxps(local_3c8,auVar192);
          bVar50 = fVar225 * fVar225 <=
                   auVar72._0_4_ * auVar72._0_4_ * (fVar196 * fVar196 + fVar250 * fVar250) &&
                   (int)uVar63 < (int)local_188;
          auVar211._0_4_ = -(uint)bVar50;
          bVar23 = fVar235 * fVar235 <=
                   auVar72._4_4_ * auVar72._4_4_ * (fVar223 * fVar223 + fVar259 * fVar259) && bVar23
          ;
          auVar211._4_4_ = -(uint)bVar23;
          bVar24 = fVar247 * fVar247 <=
                   auVar72._8_4_ * auVar72._8_4_ * (fVar224 * fVar224 + fVar261 * fVar261) && bVar24
          ;
          auVar211._8_4_ = -(uint)bVar24;
          bVar25 = fVar249 * fVar249 <=
                   auVar72._12_4_ * auVar72._12_4_ * (fVar265 * fVar265 + fVar263 * fVar263) &&
                   bVar25;
          auVar211._12_4_ = -(uint)bVar25;
          uVar64 = movmskps(SUB84(auVar59,0),auVar211);
          auVar59 = (undefined1  [8])(ulong)uVar64;
          _local_3f8 = *pauVar9;
          _local_338 = *(undefined1 (*) [16])pRVar7;
          if (uVar64 != 0) {
            fVar227 = fVar197 * local_388 + fVar152 * local_378 + fVar126 * fVar212 +
                      fVar69 * fVar198;
            fVar234 = fVar202 * fStack_384 + fVar164 * fStack_374 + fVar131 * fVar212 +
                      fVar99 * fVar198;
            fVar237 = fVar203 * fStack_380 + fVar167 * fStack_370 + fVar139 * fVar212 +
                      fVar101 * fVar198;
            fVar239 = fVar204 * fStack_37c + fVar172 * fStack_36c + fVar151 * fVar212 +
                      fVar123 * fVar198;
            local_338._0_4_ = auVar31._0_4_;
            local_338._4_4_ = auVar31._4_4_;
            uStack_330._0_4_ = auVar31._8_4_;
            local_398._0_4_ = auVar30._0_4_;
            local_398._4_4_ = auVar30._4_4_;
            fStack_390 = auVar30._8_4_;
            local_3f8._0_4_ = auVar29._0_4_;
            local_3f8._4_4_ = auVar29._4_4_;
            uStack_3f0._0_4_ = auVar29._8_4_;
            fVar70 = (float)local_3f8._0_4_ * local_388 + local_348 * local_378 +
                     (float)local_398._0_4_ * fVar212 + (float)local_338._0_4_ * fVar198;
            fVar100 = (float)local_3f8._4_4_ * fStack_384 + fStack_344 * fStack_374 +
                      (float)local_398._4_4_ * fVar212 + (float)local_338._4_4_ * fVar198;
            fVar102 = (float)uStack_3f0 * fStack_380 + fStack_340 * fStack_370 +
                      fStack_390 * fVar212 + (float)uStack_330 * fVar198;
            fVar103 = fVar153 * fStack_37c + fStack_33c * fStack_36c + fVar137 * fVar212 +
                      fVar104 * fVar198;
            pfVar1 = (float *)(lVar22 + 0x223157c + lVar58 * 4);
            fVar69 = *pfVar1;
            fVar99 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar104 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231a00 + lVar58 * 4);
            fVar123 = *pfVar1;
            fVar126 = pfVar1[1];
            fVar131 = pfVar1[2];
            fVar137 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2231e84 + lVar58 * 4);
            fVar139 = *pfVar1;
            fVar151 = pfVar1[1];
            fVar152 = pfVar1[2];
            fVar153 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2232308 + lVar58 * 4);
            fVar164 = *pfVar1;
            fVar167 = pfVar1[1];
            fVar172 = pfVar1[2];
            fVar197 = pfVar1[3];
            fVar105 = local_1b8 * fVar69 +
                      local_3e8 * fVar123 + local_358 * fVar139 + local_308 * fVar164;
            fVar106 = fStack_1b4 * fVar99 +
                      fStack_3e4 * fVar126 + fStack_354 * fVar151 + fStack_304 * fVar167;
            fVar124 = fStack_1b0 * fVar101 +
                      fStack_3e0 * fVar131 + fStack_350 * fVar152 + fStack_300 * fVar172;
            fVar125 = fStack_1ac * fVar104 +
                      fStack_3dc * fVar137 + fStack_34c * fVar153 + fStack_2fc * fVar197;
            fVar251 = local_1c8 * fVar69 +
                      local_1d8 * fVar123 + local_368 * fVar139 + local_3a8 * fVar164;
            fVar260 = fStack_1c4 * fVar99 +
                      fStack_1d4 * fVar126 + fStack_364 * fVar151 + fStack_3a4 * fVar167;
            fVar262 = fStack_1c0 * fVar101 +
                      fStack_1d0 * fVar131 + fStack_360 * fVar152 + fStack_3a0 * fVar172;
            fVar264 = fStack_1bc * fVar104 +
                      fStack_1cc * fVar137 + fStack_35c * fVar153 + fStack_39c * fVar197;
            pfVar1 = (float *)(lVar22 + 0x223399c + lVar58 * 4);
            fVar202 = *pfVar1;
            fVar203 = pfVar1[1];
            fVar204 = pfVar1[2];
            fVar225 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x22342a4 + lVar58 * 4);
            fVar235 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar249 = pfVar1[2];
            fVar165 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2234728 + lVar58 * 4);
            fVar166 = *pfVar1;
            fVar168 = pfVar1[1];
            fVar169 = pfVar1[2];
            fVar170 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2233e20 + lVar58 * 4);
            fVar171 = *pfVar1;
            fVar286 = pfVar1[1];
            fVar288 = pfVar1[2];
            fVar290 = pfVar1[3];
            fVar127 = local_1b8 * fVar202 +
                      local_3e8 * fVar171 + local_358 * fVar235 + local_308 * fVar166;
            fVar128 = fStack_1b4 * fVar203 +
                      fStack_3e4 * fVar286 + fStack_354 * fVar247 + fStack_304 * fVar168;
            fVar129 = fStack_1b0 * fVar204 +
                      fStack_3e0 * fVar288 + fStack_350 * fVar249 + fStack_300 * fVar169;
            fVar130 = fStack_1ac * fVar225 +
                      fStack_3dc * fVar290 + fStack_34c * fVar165 + fStack_2fc * fVar170;
            fVar267 = local_1c8 * fVar202 +
                      local_1d8 * fVar171 + local_368 * fVar235 + local_3a8 * fVar166;
            fVar273 = fStack_1c4 * fVar203 +
                      fStack_1d4 * fVar286 + fStack_364 * fVar247 + fStack_3a4 * fVar168;
            fVar275 = fStack_1c0 * fVar204 +
                      fStack_1d0 * fVar288 + fStack_360 * fVar249 + fStack_3a0 * fVar169;
            fVar277 = fStack_1bc * fVar225 +
                      fStack_1cc * fVar290 + fStack_35c * fVar165 + fStack_39c * fVar170;
            auVar258._0_8_ = CONCAT44(fVar106,fVar105) & 0x7fffffff7fffffff;
            auVar258._8_4_ = ABS(fVar124);
            auVar258._12_4_ = ABS(fVar125);
            auVar193._0_8_ = CONCAT44(fVar260,fVar251) & 0x7fffffff7fffffff;
            auVar193._8_4_ = ABS(fVar262);
            auVar193._12_4_ = ABS(fVar264);
            auVar72 = maxps(auVar258,auVar193);
            auVar270._0_8_ =
                 CONCAT44(fVar99 * fVar198 +
                          fVar126 * fVar212 + fVar151 * fStack_374 + fVar167 * fStack_384,
                          fVar69 * fVar198 +
                          fVar123 * fVar212 + fVar139 * local_378 + fVar164 * local_388) &
                 0x7fffffff7fffffff;
            auVar270._8_4_ =
                 ABS(fVar101 * fVar198 +
                     fVar131 * fVar212 + fVar152 * fStack_370 + fVar172 * fStack_380);
            auVar270._12_4_ =
                 ABS(fVar104 * fVar198 +
                     fVar137 * fVar212 + fVar153 * fStack_36c + fVar197 * fStack_37c);
            auVar72 = maxps(auVar72,auVar270);
            uVar64 = -(uint)(local_2a8 <= auVar72._0_4_);
            uVar65 = -(uint)(fStack_2a4 <= auVar72._4_4_);
            uVar66 = -(uint)(fStack_2a0 <= auVar72._8_4_);
            uVar67 = -(uint)(fStack_29c <= auVar72._12_4_);
            auVar194._0_4_ = ~uVar64 & (uint)fVar196;
            auVar194._4_4_ = ~uVar65 & (uint)fVar223;
            auVar194._8_4_ = ~uVar66 & (uint)fVar224;
            auVar194._12_4_ = ~uVar67 & (uint)fVar265;
            auVar246._0_4_ = (uint)fVar105 & uVar64;
            auVar246._4_4_ = (uint)fVar106 & uVar65;
            auVar246._8_4_ = (uint)fVar124 & uVar66;
            auVar246._12_4_ = (uint)fVar125 & uVar67;
            auVar246 = auVar246 | auVar194;
            fVar151 = (float)(~uVar64 & (uint)fVar250 | (uint)fVar251 & uVar64);
            fVar153 = (float)(~uVar65 & (uint)fVar259 | (uint)fVar260 & uVar65);
            fVar197 = (float)(~uVar66 & (uint)fVar261 | (uint)fVar262 & uVar66);
            fVar260 = (float)(~uVar67 & (uint)fVar263 | (uint)fVar264 & uVar67);
            auVar271._0_8_ = CONCAT44(fVar128,fVar127) & 0x7fffffff7fffffff;
            auVar271._8_4_ = ABS(fVar129);
            auVar271._12_4_ = ABS(fVar130);
            auVar134._0_8_ = CONCAT44(fVar273,fVar267) & 0x7fffffff7fffffff;
            auVar134._8_4_ = ABS(fVar275);
            auVar134._12_4_ = ABS(fVar277);
            auVar72 = maxps(auVar271,auVar134);
            auVar95._0_8_ =
                 CONCAT44(fVar203 * fVar198 +
                          fVar286 * fVar212 + fVar247 * fStack_374 + fVar168 * fStack_384,
                          fVar202 * fVar198 +
                          fVar171 * fVar212 + fVar235 * local_378 + fVar166 * local_388) &
                 0x7fffffff7fffffff;
            auVar95._8_4_ =
                 ABS(fVar204 * fVar198 +
                     fVar288 * fVar212 + fVar249 * fStack_370 + fVar169 * fStack_380);
            auVar95._12_4_ =
                 ABS(fVar225 * fVar198 +
                     fVar290 * fVar212 + fVar165 * fStack_36c + fVar170 * fStack_37c);
            auVar72 = maxps(auVar72,auVar95);
            uVar64 = -(uint)(local_2a8 <= auVar72._0_4_);
            uVar65 = -(uint)(fStack_2a4 <= auVar72._4_4_);
            uVar66 = -(uint)(fStack_2a0 <= auVar72._8_4_);
            uVar67 = -(uint)(fStack_29c <= auVar72._12_4_);
            fVar166 = (float)((uint)fVar127 & uVar64 | ~uVar64 & (uint)fVar196);
            fVar168 = (float)((uint)fVar128 & uVar65 | ~uVar65 & (uint)fVar223);
            fVar169 = (float)((uint)fVar129 & uVar66 | ~uVar66 & (uint)fVar224);
            fVar170 = (float)((uint)fVar130 & uVar67 | ~uVar67 & (uint)fVar265);
            fVar202 = (float)(~uVar64 & (uint)fVar250 | (uint)fVar267 & uVar64);
            fVar203 = (float)(~uVar65 & (uint)fVar259 | (uint)fVar273 & uVar65);
            fVar204 = (float)(~uVar66 & (uint)fVar261 | (uint)fVar275 & uVar66);
            fVar235 = (float)(~uVar67 & (uint)fVar263 | (uint)fVar277 & uVar67);
            fVar137 = auVar246._0_4_;
            fVar69 = auVar246._4_4_;
            fVar99 = auVar246._8_4_;
            fVar101 = auVar246._12_4_;
            auVar160._0_4_ = fVar151 * fVar151 + fVar137 * fVar137;
            auVar160._4_4_ = fVar153 * fVar153 + fVar69 * fVar69;
            auVar160._8_4_ = fVar197 * fVar197 + fVar99 * fVar99;
            auVar160._12_4_ = fVar260 * fVar260 + fVar101 * fVar101;
            auVar72 = rsqrtps(auVar194,auVar160);
            fVar104 = auVar72._0_4_;
            fVar123 = auVar72._4_4_;
            fVar126 = auVar72._8_4_;
            fVar131 = auVar72._12_4_;
            auVar195._0_4_ = fVar104 * fVar104 * auVar160._0_4_ * 0.5 * fVar104;
            auVar195._4_4_ = fVar123 * fVar123 * auVar160._4_4_ * 0.5 * fVar123;
            auVar195._8_4_ = fVar126 * fVar126 * auVar160._8_4_ * 0.5 * fVar126;
            auVar195._12_4_ = fVar131 * fVar131 * auVar160._12_4_ * 0.5 * fVar131;
            fVar164 = fVar104 * 1.5 - auVar195._0_4_;
            fVar167 = fVar123 * 1.5 - auVar195._4_4_;
            fVar172 = fVar126 * 1.5 - auVar195._8_4_;
            fVar196 = fVar131 * 1.5 - auVar195._12_4_;
            auVar161._0_4_ = fVar202 * fVar202 + fVar166 * fVar166;
            auVar161._4_4_ = fVar203 * fVar203 + fVar168 * fVar168;
            auVar161._8_4_ = fVar204 * fVar204 + fVar169 * fVar169;
            auVar161._12_4_ = fVar235 * fVar235 + fVar170 * fVar170;
            auVar72 = rsqrtps(auVar195,auVar161);
            fVar104 = auVar72._0_4_;
            fVar123 = auVar72._4_4_;
            fVar126 = auVar72._8_4_;
            fVar131 = auVar72._12_4_;
            fVar139 = fVar104 * 1.5 - fVar104 * fVar104 * auVar161._0_4_ * 0.5 * fVar104;
            fVar123 = fVar123 * 1.5 - fVar123 * fVar123 * auVar161._4_4_ * 0.5 * fVar123;
            fVar152 = fVar126 * 1.5 - fVar126 * fVar126 * auVar161._8_4_ * 0.5 * fVar126;
            fVar131 = fVar131 * 1.5 - fVar131 * fVar131 * auVar161._12_4_ * 0.5 * fVar131;
            fVar171 = fVar151 * fVar164 * (float)local_3c8._0_4_;
            fVar288 = fVar153 * fVar167 * local_3c8._4_4_;
            fVar251 = fVar197 * fVar172 * local_3c8._8_4_;
            fVar262 = fVar260 * fVar196 * local_3c8._12_4_;
            fVar126 = -fVar137 * fVar164 * (float)local_3c8._0_4_;
            fVar137 = -fVar69 * fVar167 * local_3c8._4_4_;
            fVar151 = -fVar99 * fVar172 * local_3c8._8_4_;
            fVar153 = -fVar101 * fVar196 * local_3c8._12_4_;
            fVar223 = fVar164 * 0.0 * (float)local_3c8._0_4_;
            fVar224 = fVar167 * 0.0 * local_3c8._4_4_;
            fVar265 = fVar172 * 0.0 * local_3c8._8_4_;
            fVar225 = fVar196 * 0.0 * local_3c8._12_4_;
            local_398._0_4_ = fVar70 + fVar223;
            local_398._4_4_ = fVar100 + fVar224;
            fStack_390 = fVar102 + fVar265;
            fStack_38c = fVar103 + fVar225;
            fVar267 = fVar202 * fVar139 * auVar192._0_4_;
            fVar273 = fVar203 * fVar123 * auVar192._4_4_;
            fVar275 = fVar204 * fVar152 * auVar192._8_4_;
            fVar277 = fVar235 * fVar131 * auVar192._12_4_;
            fVar235 = fVar266 + fVar267;
            fVar247 = fVar272 + fVar273;
            fVar249 = fVar274 + fVar275;
            fVar165 = fVar276 + fVar277;
            fVar69 = -fVar166 * fVar139 * auVar192._0_4_;
            fVar99 = -fVar168 * fVar123 * auVar192._4_4_;
            fVar101 = -fVar169 * fVar152 * auVar192._8_4_;
            fVar104 = -fVar170 * fVar131 * auVar192._12_4_;
            fVar166 = local_3d8 + fVar69;
            fVar168 = fStack_3d4 + fVar99;
            fVar169 = fStack_3d0 + fVar101;
            fVar170 = fStack_3cc + fVar104;
            fVar167 = fVar139 * 0.0 * auVar192._0_4_;
            fVar196 = fVar123 * 0.0 * auVar192._4_4_;
            fVar202 = fVar152 * 0.0 * auVar192._8_4_;
            fVar204 = fVar131 * 0.0 * auVar192._12_4_;
            fVar123 = fVar213 - fVar171;
            fVar131 = fVar217 - fVar288;
            fVar139 = fVar214 - fVar251;
            fVar152 = fVar215 - fVar262;
            fVar286 = fVar227 + fVar167;
            fVar290 = fVar234 + fVar196;
            fVar260 = fVar237 + fVar202;
            fVar264 = fVar239 + fVar204;
            fVar164 = fVar216 - fVar126;
            fVar172 = fVar232 - fVar137;
            fVar197 = fVar240 - fVar151;
            fVar203 = fVar248 - fVar153;
            fVar70 = fVar70 - fVar223;
            fVar100 = fVar100 - fVar224;
            fVar102 = fVar102 - fVar265;
            fVar103 = fVar103 - fVar225;
            uVar64 = -(uint)(0.0 < (fVar164 * (fVar286 - fVar70) - fVar70 * (fVar166 - fVar164)) *
                                   0.0 + (fVar70 * (fVar235 - fVar123) -
                                         (fVar286 - fVar70) * fVar123) * 0.0 +
                                         ((fVar166 - fVar164) * fVar123 -
                                         (fVar235 - fVar123) * fVar164));
            uVar65 = -(uint)(0.0 < (fVar172 * (fVar290 - fVar100) - fVar100 * (fVar168 - fVar172)) *
                                   0.0 + (fVar100 * (fVar247 - fVar131) -
                                         (fVar290 - fVar100) * fVar131) * 0.0 +
                                         ((fVar168 - fVar172) * fVar131 -
                                         (fVar247 - fVar131) * fVar172));
            uVar66 = -(uint)(0.0 < (fVar197 * (fVar260 - fVar102) - fVar102 * (fVar169 - fVar197)) *
                                   0.0 + (fVar102 * (fVar249 - fVar139) -
                                         (fVar260 - fVar102) * fVar139) * 0.0 +
                                         ((fVar169 - fVar197) * fVar139 -
                                         (fVar249 - fVar139) * fVar197));
            uVar67 = -(uint)(0.0 < (fVar203 * (fVar264 - fVar103) - fVar103 * (fVar170 - fVar203)) *
                                   0.0 + (fVar103 * (fVar165 - fVar152) -
                                         (fVar264 - fVar103) * fVar152) * 0.0 +
                                         ((fVar170 - fVar203) * fVar152 -
                                         (fVar165 - fVar152) * fVar203));
            fVar266 = (float)((uint)(fVar266 - fVar267) & uVar64 |
                             ~uVar64 & (uint)(fVar213 + fVar171));
            fVar272 = (float)((uint)(fVar272 - fVar273) & uVar65 |
                             ~uVar65 & (uint)(fVar217 + fVar288));
            fStack_3b0 = (float)((uint)(fVar274 - fVar275) & uVar66 |
                                ~uVar66 & (uint)(fVar214 + fVar251));
            fStack_3ac = (float)((uint)(fVar276 - fVar277) & uVar67 |
                                ~uVar67 & (uint)(fVar215 + fVar262));
            local_3d8 = (float)((uint)(local_3d8 - fVar69) & uVar64 |
                               ~uVar64 & (uint)(fVar216 + fVar126));
            fStack_3d4 = (float)((uint)(fStack_3d4 - fVar99) & uVar65 |
                                ~uVar65 & (uint)(fVar232 + fVar137));
            fStack_3d0 = (float)((uint)(fStack_3d0 - fVar101) & uVar66 |
                                ~uVar66 & (uint)(fVar240 + fVar151));
            fStack_3cc = (float)((uint)(fStack_3cc - fVar104) & uVar67 |
                                ~uVar67 & (uint)(fVar248 + fVar153));
            fVar276 = (float)((uint)(fVar227 - fVar167) & uVar64 | ~uVar64 & local_398._0_4_);
            fVar171 = (float)((uint)(fVar234 - fVar196) & uVar65 | ~uVar65 & local_398._4_4_);
            fVar288 = (float)((uint)(fVar237 - fVar202) & uVar66 | ~uVar66 & (uint)fStack_390);
            fVar227 = (float)((uint)(fVar239 - fVar204) & uVar67 | ~uVar67 & (uint)fStack_38c);
            fVar126 = (float)((uint)fVar123 & uVar64 | ~uVar64 & (uint)fVar235);
            fVar137 = (float)((uint)fVar131 & uVar65 | ~uVar65 & (uint)fVar247);
            fVar151 = (float)((uint)fVar139 & uVar66 | ~uVar66 & (uint)fVar249);
            fVar153 = (float)((uint)fVar152 & uVar67 | ~uVar67 & (uint)fVar165);
            fVar167 = (float)((uint)fVar164 & uVar64 | ~uVar64 & (uint)fVar166);
            fVar196 = (float)((uint)fVar172 & uVar65 | ~uVar65 & (uint)fVar168);
            fVar202 = (float)((uint)fVar197 & uVar66 | ~uVar66 & (uint)fVar169);
            fVar204 = (float)((uint)fVar203 & uVar67 | ~uVar67 & (uint)fVar170);
            fVar213 = (float)((uint)fVar70 & uVar64 | ~uVar64 & (uint)fVar286);
            fVar217 = (float)((uint)fVar100 & uVar65 | ~uVar65 & (uint)fVar290);
            fVar223 = (float)((uint)fVar102 & uVar66 | ~uVar66 & (uint)fVar260);
            fVar224 = (float)((uint)fVar103 & uVar67 | ~uVar67 & (uint)fVar264);
            fVar265 = (float)((uint)fVar235 & uVar64 | ~uVar64 & (uint)fVar123) - fVar266;
            fVar214 = (float)((uint)fVar247 & uVar65 | ~uVar65 & (uint)fVar131) - fVar272;
            fVar215 = (float)((uint)fVar249 & uVar66 | ~uVar66 & (uint)fVar139) - fStack_3b0;
            fVar216 = (float)((uint)fVar165 & uVar67 | ~uVar67 & (uint)fVar152) - fStack_3ac;
            fVar164 = (float)((uint)fVar166 & uVar64 | ~uVar64 & (uint)fVar164) - local_3d8;
            fVar172 = (float)((uint)fVar168 & uVar65 | ~uVar65 & (uint)fVar172) - fStack_3d4;
            fVar197 = (float)((uint)fVar169 & uVar66 | ~uVar66 & (uint)fVar197) - fStack_3d0;
            fVar203 = (float)((uint)fVar170 & uVar67 | ~uVar67 & (uint)fVar203) - fStack_3cc;
            fVar225 = (float)((uint)fVar286 & uVar64 | ~uVar64 & (uint)fVar70) - fVar276;
            fVar232 = (float)((uint)fVar290 & uVar65 | ~uVar65 & (uint)fVar100) - fVar171;
            fVar235 = (float)((uint)fVar260 & uVar66 | ~uVar66 & (uint)fVar102) - fVar288;
            fVar240 = (float)((uint)fVar264 & uVar67 | ~uVar67 & (uint)fVar103) - fVar227;
            fVar165 = fVar266 - fVar126;
            fVar166 = fVar272 - fVar137;
            fVar168 = fStack_3b0 - fVar151;
            fVar169 = fStack_3ac - fVar153;
            fVar69 = local_3d8 - fVar167;
            fVar99 = fStack_3d4 - fVar196;
            fVar101 = fStack_3d0 - fVar202;
            fVar104 = fStack_3cc - fVar204;
            local_3b8 = (RTCIntersectArguments *)CONCAT44(fVar272,fVar266);
            fVar123 = fVar276 - fVar213;
            fVar131 = fVar171 - fVar217;
            fVar139 = fVar288 - fVar223;
            fVar152 = fVar227 - fVar224;
            fVar247 = (local_3d8 * fVar225 - fVar276 * fVar164) * 0.0 +
                      (fVar276 * fVar265 - fVar266 * fVar225) * 0.0 +
                      (fVar266 * fVar164 - local_3d8 * fVar265);
            fVar248 = (fStack_3d4 * fVar232 - fVar171 * fVar172) * 0.0 +
                      (fVar171 * fVar214 - fVar272 * fVar232) * 0.0 +
                      (fVar272 * fVar172 - fStack_3d4 * fVar214);
            auVar149._4_4_ = fVar248;
            auVar149._0_4_ = fVar247;
            fVar249 = (fStack_3d0 * fVar235 - fVar288 * fVar197) * 0.0 +
                      (fVar288 * fVar215 - fStack_3b0 * fVar235) * 0.0 +
                      (fStack_3b0 * fVar197 - fStack_3d0 * fVar215);
            fVar274 = (fStack_3cc * fVar240 - fVar227 * fVar203) * 0.0 +
                      (fVar227 * fVar216 - fStack_3ac * fVar240) * 0.0 +
                      (fStack_3ac * fVar203 - fStack_3cc * fVar216);
            auVar280._0_4_ =
                 (fVar167 * fVar123 - fVar213 * fVar69) * 0.0 +
                 (fVar213 * fVar165 - fVar126 * fVar123) * 0.0 +
                 (fVar126 * fVar69 - fVar167 * fVar165);
            auVar280._4_4_ =
                 (fVar196 * fVar131 - fVar217 * fVar99) * 0.0 +
                 (fVar217 * fVar166 - fVar137 * fVar131) * 0.0 +
                 (fVar137 * fVar99 - fVar196 * fVar166);
            auVar280._8_4_ =
                 (fVar202 * fVar139 - fVar223 * fVar101) * 0.0 +
                 (fVar223 * fVar168 - fVar151 * fVar139) * 0.0 +
                 (fVar151 * fVar101 - fVar202 * fVar168);
            auVar280._12_4_ =
                 (fVar204 * fVar152 - fVar224 * fVar104) * 0.0 +
                 (fVar224 * fVar169 - fVar153 * fVar152) * 0.0 +
                 (fVar153 * fVar104 - fVar204 * fVar169);
            auVar149._8_4_ = fVar249;
            auVar149._12_4_ = fVar274;
            auVar72 = maxps(auVar149,auVar280);
            bVar50 = auVar72._0_4_ <= 0.0 && bVar50;
            auVar150._0_4_ = -(uint)bVar50;
            bVar23 = auVar72._4_4_ <= 0.0 && bVar23;
            auVar150._4_4_ = -(uint)bVar23;
            bVar24 = auVar72._8_4_ <= 0.0 && bVar24;
            auVar150._8_4_ = -(uint)bVar24;
            bVar25 = auVar72._12_4_ <= 0.0 && bVar25;
            auVar150._12_4_ = -(uint)bVar25;
            iVar51 = movmskps((int)(catmullrom_basis1 + lVar22),auVar150);
            if (iVar51 == 0) {
LAB_00c2c18f:
              iVar51 = 0;
              auVar136._8_8_ = uStack_2d0;
              auVar136._0_8_ = local_2d8;
            }
            else {
              fVar126 = ray->tfar;
              fVar151 = fVar69 * fVar225 - fVar123 * fVar164;
              fVar153 = fVar99 * fVar232 - fVar131 * fVar172;
              fVar167 = fVar101 * fVar235 - fVar139 * fVar197;
              fVar196 = fVar104 * fVar240 - fVar152 * fVar203;
              fVar123 = fVar123 * fVar265 - fVar225 * fVar165;
              fVar131 = fVar131 * fVar214 - fVar232 * fVar166;
              fVar137 = fVar139 * fVar215 - fVar235 * fVar168;
              fVar139 = fVar152 * fVar216 - fVar240 * fVar169;
              fVar152 = fVar165 * fVar164 - fVar69 * fVar265;
              fVar164 = fVar166 * fVar172 - fVar99 * fVar214;
              fVar172 = fVar168 * fVar197 - fVar101 * fVar215;
              fVar197 = fVar169 * fVar203 - fVar104 * fVar216;
              auVar135._0_4_ = fVar123 * 0.0 + fVar152;
              auVar135._4_4_ = fVar131 * 0.0 + fVar164;
              auVar135._8_4_ = fVar137 * 0.0 + fVar172;
              auVar135._12_4_ = fVar139 * 0.0 + fVar197;
              auVar201._0_4_ = fVar151 * 0.0 + auVar135._0_4_;
              auVar201._4_4_ = fVar153 * 0.0 + auVar135._4_4_;
              auVar201._8_4_ = fVar167 * 0.0 + auVar135._8_4_;
              auVar201._12_4_ = fVar196 * 0.0 + auVar135._12_4_;
              auVar72 = rcpps(auVar135,auVar201);
              fVar69 = auVar72._0_4_;
              fVar99 = auVar72._4_4_;
              fVar101 = auVar72._8_4_;
              fVar104 = auVar72._12_4_;
              fVar69 = (1.0 - auVar201._0_4_ * fVar69) * fVar69 + fVar69;
              fVar99 = (1.0 - auVar201._4_4_ * fVar99) * fVar99 + fVar99;
              fVar101 = (1.0 - auVar201._8_4_ * fVar101) * fVar101 + fVar101;
              fVar104 = (1.0 - auVar201._12_4_ * fVar104) * fVar104 + fVar104;
              fVar123 = (fVar276 * fVar152 + local_3d8 * fVar123 + fVar266 * fVar151) * fVar69;
              fVar131 = (fVar171 * fVar164 + fStack_3d4 * fVar131 + fVar272 * fVar153) * fVar99;
              fVar137 = (fVar288 * fVar172 + fStack_3d0 * fVar137 + fStack_3b0 * fVar167) * fVar101;
              fVar139 = (fVar227 * fVar197 + fStack_3cc * fVar139 + fStack_3ac * fVar196) * fVar104;
              bVar50 = (fVar123 <= fVar126 && (float)local_1e8._0_4_ <= fVar123) && bVar50;
              auVar162._0_4_ = -(uint)bVar50;
              bVar23 = (fVar131 <= fVar126 && (float)local_1e8._4_4_ <= fVar131) && bVar23;
              auVar162._4_4_ = -(uint)bVar23;
              bVar24 = (fVar137 <= fVar126 && fStack_1e0 <= fVar137) && bVar24;
              auVar162._8_4_ = -(uint)bVar24;
              bVar25 = (fVar139 <= fVar126 && fStack_1dc <= fVar139) && bVar25;
              auVar162._12_4_ = -(uint)bVar25;
              iVar51 = movmskps(iVar51,auVar162);
              if (iVar51 == 0) goto LAB_00c2c18f;
              auVar163._0_8_ =
                   CONCAT44(-(uint)(auVar201._4_4_ != 0.0 && bVar23),
                            -(uint)(auVar201._0_4_ != 0.0 && bVar50));
              auVar163._8_4_ = -(uint)(auVar201._8_4_ != 0.0 && bVar24);
              auVar163._12_4_ = -(uint)(auVar201._12_4_ != 0.0 && bVar25);
              iVar51 = movmskps(iVar51,auVar163);
              auVar136._8_8_ = uStack_2d0;
              auVar136._0_8_ = local_2d8;
              if (iVar51 != 0) {
                fVar247 = fVar247 * fVar69;
                fVar248 = fVar248 * fVar99;
                fVar249 = fVar249 * fVar101;
                fVar274 = fVar274 * fVar104;
                local_2e8 = (float)((uint)(1.0 - fVar247) & uVar64 | ~uVar64 & (uint)fVar247);
                fStack_2e4 = (float)((uint)(1.0 - fVar248) & uVar65 | ~uVar65 & (uint)fVar248);
                fStack_2e0 = (float)((uint)(1.0 - fVar249) & uVar66 | ~uVar66 & (uint)fVar249);
                fStack_2dc = (float)((uint)(1.0 - fVar274) & uVar67 | ~uVar67 & (uint)fVar274);
                local_1a8 = (float)(~uVar64 & (uint)(auVar280._0_4_ * fVar69) |
                                   (uint)(1.0 - auVar280._0_4_ * fVar69) & uVar64);
                fStack_1a4 = (float)(~uVar65 & (uint)(auVar280._4_4_ * fVar99) |
                                    (uint)(1.0 - auVar280._4_4_ * fVar99) & uVar65);
                fStack_1a0 = (float)(~uVar66 & (uint)(auVar280._8_4_ * fVar101) |
                                    (uint)(1.0 - auVar280._8_4_ * fVar101) & uVar66);
                fStack_19c = (float)(~uVar67 & (uint)(auVar280._12_4_ * fVar104) |
                                    (uint)(1.0 - auVar280._12_4_ * fVar104) & uVar67);
                auVar136._8_4_ = auVar163._8_4_;
                auVar136._0_8_ = auVar163._0_8_;
                auVar136._12_4_ = auVar163._12_4_;
                local_268 = fVar123;
                fStack_264 = fVar131;
                fStack_260 = fVar137;
                fStack_25c = fVar139;
              }
            }
            iVar51 = movmskps(iVar51,auVar136);
            _local_3f8 = auVar192;
            _local_338 = auVar211;
            local_258 = fVar250;
            fStack_254 = fVar259;
            fStack_250 = fVar261;
            fStack_24c = fVar263;
            if (iVar51 != 0) {
              fVar99 = (auVar192._0_4_ - (float)local_3c8._0_4_) * local_2e8 +
                       (float)local_3c8._0_4_;
              fVar101 = (auVar192._4_4_ - local_3c8._4_4_) * fStack_2e4 + local_3c8._4_4_;
              fVar104 = (auVar192._8_4_ - local_3c8._8_4_) * fStack_2e0 + local_3c8._8_4_;
              fVar123 = (auVar192._12_4_ - local_3c8._12_4_) * fStack_2dc + local_3c8._12_4_;
              fVar69 = local_2f0->depth_scale;
              auVar96._0_4_ = -(uint)(fVar69 * (fVar99 + fVar99) < local_268) & auVar136._0_4_;
              auVar96._4_4_ = -(uint)(fVar69 * (fVar101 + fVar101) < fStack_264) & auVar136._4_4_;
              auVar96._8_4_ = -(uint)(fVar69 * (fVar104 + fVar104) < fStack_260) & auVar136._8_4_;
              auVar96._12_4_ = -(uint)(fVar69 * (fVar123 + fVar123) < fStack_25c) & auVar136._12_4_;
              uVar64 = movmskps((int)local_2f0,auVar96);
              if (uVar64 != 0) {
                local_1a8 = local_1a8 + local_1a8 + -1.0;
                fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
                fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
                fStack_19c = fStack_19c + fStack_19c + -1.0;
                local_138 = CONCAT44(fStack_1f4,local_1f8);
                uStack_130 = CONCAT44(fStack_1ec,fStack_1f0);
                local_128 = CONCAT44(fStack_84,local_88);
                uStack_120 = CONCAT44(fStack_7c,fStack_80);
                local_118 = CONCAT44(fStack_94,local_98);
                uStack_110 = CONCAT44(fStack_8c,fStack_90);
                local_108 = CONCAT44(fStack_74,local_78);
                uStack_100 = CONCAT44(fStack_6c,fStack_70);
                auVar59 = (undefined1  [8])(context->scene->geometries).items[local_2f8].ptr;
                local_178 = local_2e8;
                fStack_174 = fStack_2e4;
                fStack_170 = fStack_2e0;
                fStack_16c = fStack_2dc;
                local_168 = local_1a8;
                fStack_164 = fStack_1a4;
                fStack_160 = fStack_1a0;
                fStack_15c = fStack_19c;
                local_158 = local_268;
                fStack_154 = fStack_264;
                fStack_150 = fStack_260;
                fStack_14c = fStack_25c;
                local_148 = uVar63;
                local_f8 = auVar96;
                if ((((Geometry *)auVar59)->mask & ray->mask) == 0) {
                  pRVar56 = (RTCIntersectArguments *)0x0;
                  local_144 = fVar138;
                }
                else {
                  pRVar56 = context->args;
                  if ((pRVar56->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar56 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar56 >> 8),1),
                     local_144 = fVar138,
                     ((Geometry *)auVar59)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_3d8 = (float)uVar61;
                    fVar69 = (float)(int)uVar63;
                    local_e8[0] = (fVar69 + local_2e8 + 0.0) * (float)local_208._0_4_;
                    local_e8[1] = (fVar69 + fStack_2e4 + 1.0) * (float)local_208._4_4_;
                    local_e8[2] = (fVar69 + fStack_2e0 + 2.0) * fStack_200;
                    local_e8[3] = (fVar69 + fStack_2dc + 3.0) * fStack_1fc;
                    local_d8 = CONCAT44(fStack_1a4,local_1a8);
                    uStack_d0 = CONCAT44(fStack_19c,fStack_1a0);
                    local_c8[0] = local_268;
                    local_c8[1] = fStack_264;
                    local_c8[2] = fStack_260;
                    local_c8[3] = fStack_25c;
                    uVar60 = (ulong)(uVar64 & 0xff);
                    pRVar53 = (RTCIntersectArguments *)0x0;
                    if (uVar60 != 0) {
                      for (; ((uVar64 & 0xff) >> (long)pRVar53 & 1) == 0;
                          pRVar53 = (RTCIntersectArguments *)((long)&pRVar53->flags + 1)) {
                      }
                    }
                    uStack_330 = uStack_100;
                    local_338 = (undefined1  [8])local_108;
                    uVar61 = CONCAT71((int7)((ulong)pRVar56 >> 8),1);
                    uStack_3f0 = auVar192._8_8_;
                    local_3f8 = auVar59;
                    local_328 = local_118;
                    uStack_320 = uStack_110;
                    local_318 = local_128;
                    uStack_310 = uStack_120;
                    local_144 = fVar138;
                    do {
                      local_398._0_4_ = (int)uVar61;
                      local_23c = local_e8[(long)pRVar53];
                      local_238 = *(undefined4 *)((long)&local_d8 + (long)pRVar53 * 4);
                      local_3c8._0_4_ = ray->tfar;
                      ray->tfar = local_c8[(long)pRVar53];
                      fVar69 = 1.0 - local_23c;
                      fVar101 = local_23c * 3.0;
                      fVar104 = ((fVar101 + 2.0) * (fVar69 + fVar69) + fVar69 * -3.0 * fVar69) * 0.5
                      ;
                      fVar99 = (fVar69 * -2.0 * local_23c + local_23c * local_23c) * 0.5;
                      fVar101 = (local_23c * fVar101 + (fVar101 + -5.0) * (local_23c + local_23c)) *
                                0.5;
                      fVar69 = (local_23c * (fVar69 + fVar69) - fVar69 * fVar69) * 0.5;
                      local_248 = CONCAT44(fVar69 * fStack_1f4 +
                                           fVar101 * local_318._4_4_ +
                                           fVar104 * local_328._4_4_ +
                                           fVar99 * (float)local_338._4_4_,
                                           fVar69 * local_1f8 +
                                           fVar101 * (float)local_318 +
                                           fVar104 * (float)local_328 +
                                           fVar99 * (float)local_338._0_4_);
                      local_240 = fVar69 * fStack_1f0 +
                                  fVar101 * (float)uStack_310 +
                                  fVar104 * (float)uStack_320 + fVar99 * (float)uStack_330;
                      local_298.context = context->user;
                      local_234 = (undefined4)local_210;
                      local_230 = (undefined4)local_2f8;
                      local_22c = (local_298.context)->instID[0];
                      local_228 = (local_298.context)->instPrimID[0];
                      local_3fc = -1;
                      local_298.valid = &local_3fc;
                      pRVar56 = (RTCIntersectArguments *)((Geometry *)auVar59)->userPtr;
                      local_298.hit = (RTCHitN *)&local_248;
                      local_298.N = 1;
                      local_3b8 = pRVar53;
                      local_298.geometryUserPtr = pRVar56;
                      local_298.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar59)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c2c088:
                        pRVar56 = context->args;
                        if (pRVar56->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar56->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar59)->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar56->filter)(&local_298);
                            auVar59 = local_3f8;
                          }
                          if (*local_298.valid == 0) goto LAB_00c2c0ce;
                        }
                        uVar61 = (ulong)(uint)local_398._0_4_;
                        break;
                      }
                      (*((Geometry *)auVar59)->occlusionFilterN)(&local_298);
                      auVar59 = local_3f8;
                      if (*local_298.valid != 0) goto LAB_00c2c088;
LAB_00c2c0ce:
                      ray->tfar = (float)local_3c8._0_4_;
                      uVar60 = uVar60 ^ 1L << ((ulong)local_3b8 & 0x3f);
                      pRVar53 = (RTCIntersectArguments *)0x0;
                      if (uVar60 != 0) {
                        for (; (uVar60 >> (long)pRVar53 & 1) == 0;
                            pRVar53 = (RTCIntersectArguments *)((long)&pRVar53->flags + 1)) {
                        }
                      }
                      uVar61 = CONCAT71((int7)((ulong)pRVar56 >> 8),uVar60 != 0);
                    } while (uVar60 != 0);
                    pRVar56 = (RTCIntersectArguments *)(uVar61 & 0xffffffffffffff01);
                    uVar61 = (ulong)(uint)local_3d8;
                  }
                }
                uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | (byte)pRVar56);
              }
            }
          }
          uVar54 = SUB84(pRVar56,0);
          lVar58 = lVar58 + 4;
          fVar196 = local_3e8;
          fVar223 = fStack_3e4;
          fVar224 = fStack_3e0;
          fVar265 = fStack_3dc;
        } while ((int)lVar58 < (int)fVar138);
      }
      if ((uVar61 & 1) != 0) {
        return local_439;
      }
      fVar138 = ray->tfar;
      auVar122._4_4_ = -(uint)(fStack_44 <= fVar138);
      auVar122._0_4_ = -(uint)(local_48 <= fVar138);
      auVar122._8_4_ = -(uint)(fStack_40 <= fVar138);
      auVar122._12_4_ = -(uint)(fStack_3c <= fVar138);
      uVar63 = movmskps(uVar54,auVar122);
      uVar62 = uVar62 & uVar62 + 0xf & uVar63;
      local_439 = uVar62 != 0;
    } while (local_439);
  }
  return local_439;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }